

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

fdb_compact_decision
compaction_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_encryption_key *pfVar1;
  uint64_t *puVar2;
  short *psVar3;
  fdb_status fVar4;
  int iVar5;
  btree *pbVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_kvs_handle *pfVar11;
  size_t sVar12;
  uint64_t extraout_RAX;
  uint64_t uVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_config *config;
  fdb_kvs_info *info;
  fdb_file_info *__n;
  fdb_file_info *kvs_config;
  void *__s2;
  ulong uVar15;
  size_t sVar16;
  code *__s;
  void *pvVar17;
  fdb_kvs_handle **ppfVar18;
  fdb_kvs_handle *pfVar19;
  char *pcVar20;
  char cVar21;
  fdb_kvs_handle *pfVar22;
  char *pcVar23;
  fdb_file_info *info_00;
  fdb_file_handle *pfVar24;
  fdb_iterator *pfVar25;
  fdb_doc *pfVar26;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle [8];
  uint uVar27;
  long lVar28;
  bool *pbVar29;
  fdb_config *pfVar30;
  ulong uVar31;
  size_t sVar32;
  btree *pbVar33;
  fdb_doc **ppfVar34;
  __atomic_base<unsigned_long> _Var35;
  timeval tVar36;
  timeval tVar37;
  fdb_doc *rdoc;
  timeval __test_begin;
  fdb_kvs_handle *pfStack_18ba0;
  undefined1 auStack_18b98 [16];
  undefined1 auStack_18b88 [8];
  undefined1 auStack_18b80 [80];
  ulong uStack_18b30;
  timeval tStack_18b10;
  fdb_file_info afStack_18b00 [3];
  fdb_file_info afStack_18a00 [3];
  fdb_config fStack_18900;
  fdb_kvs_handle *pfStack_18808;
  fdb_kvs_handle *pfStack_18800;
  fdb_kvs_handle *pfStack_187f8;
  fdb_config *pfStack_187f0;
  fdb_doc **ppfStack_187e8;
  fdb_kvs_handle *pfStack_187e0;
  fdb_file_handle *pfStack_187d0;
  fdb_kvs_handle *pfStack_187c8;
  timeval atStack_187c0 [2];
  timeval tStack_187a0;
  timeval tStack_18790;
  undefined1 auStack_18780 [70];
  undefined1 uStack_1873a;
  undefined8 uStack_18730;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18670;
  fdb_kvs_handle *pfStack_18668;
  fdb_kvs_handle *pfStack_18660;
  fdb_kvs_handle *pfStack_18658;
  fdb_doc **ppfStack_18650;
  fdb_kvs_handle *pfStack_18648;
  undefined1 auStack_18630 [16];
  fdb_kvs_handle *pfStack_18620;
  fdb_kvs_handle *pfStack_18618;
  fdb_kvs_handle *pfStack_18610;
  fdb_kvs_handle *pfStack_18608;
  fdb_kvs_handle *pfStack_18600;
  fdb_kvs_config fStack_185f8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_185e0;
  filemgr *pfStack_185d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_185d0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_185c8;
  filemgr *pfStack_185c0;
  fdb_kvs_handle *pfStack_185b8;
  timeval tStack_185b0;
  undefined1 auStack_185a0 [256];
  __atomic_base<unsigned_long> _Stack_184a0;
  timeval tStack_18498;
  __atomic_base<unsigned_long> _Stack_18488;
  fdb_doc *apfStack_18440 [32];
  char acStack_18340 [256];
  char acStack_18240 [256];
  fdb_kvs_handle afStack_18140 [153];
  char acStack_48c0 [8];
  fdb_kvs_handle *pfStack_48b8;
  fdb_kvs_handle *pfStack_48b0;
  fdb_kvs_handle *pfStack_48a8;
  fdb_kvs_handle *pfStack_48a0;
  fdb_doc **ppfStack_4898;
  fdb_kvs_handle *pfStack_4890;
  fdb_kvs_handle *pfStack_4878;
  fdb_kvs_handle *pfStack_4870;
  fdb_doc *pfStack_4868;
  void *pvStack_4860;
  fdb_kvs_config fStack_4858;
  undefined1 auStack_4840 [48];
  timeval tStack_4810;
  undefined1 auStack_4800 [760];
  char acStack_4508 [256];
  fdb_doc *apfStack_4408 [101];
  fdb_kvs_handle **ppfStack_40e0;
  fdb_kvs_handle *pfStack_40d8;
  fdb_kvs_handle *pfStack_40d0;
  fdb_kvs_info *pfStack_40c8;
  fdb_doc **ppfStack_40c0;
  fdb_kvs_handle *pfStack_40b8;
  undefined1 auStack_40a0 [16];
  undefined1 auStack_4090 [24];
  undefined1 auStack_4078 [32];
  fdb_kvs_handle *apfStack_4058 [5];
  timeval tStack_4030;
  char acStack_4020 [256];
  fdb_doc *apfStack_3f20 [31];
  fdb_config fStack_3e28;
  undefined1 auStack_3d30 [752];
  undefined8 auStack_3a40 [31];
  fdb_kvs_handle **ppfStack_3948;
  fdb_kvs_handle *pfStack_3940;
  fdb_kvs_handle *pfStack_3938;
  fdb_kvs_config *pfStack_3930;
  fdb_doc **ppfStack_3928;
  fdb_kvs_handle *pfStack_3920;
  fdb_kvs_handle *pfStack_3908;
  fdb_kvs_handle *pfStack_3900;
  fdb_doc *pfStack_38f8;
  fdb_kvs_handle *pfStack_38f0;
  fdb_doc *apfStack_38e8 [11];
  timeval tStack_3890;
  fdb_kvs_config fStack_3880;
  char acStack_3868 [256];
  undefined1 auStack_3768 [656];
  fdb_config fStack_34d8;
  fdb_kvs_handle **ppfStack_33e0;
  fdb_kvs_handle *pfStack_33d8;
  fdb_kvs_handle *pfStack_33d0;
  btree *pbStack_33c8;
  btree *pbStack_33c0;
  fdb_kvs_handle *pfStack_33b8;
  fdb_kvs_handle *pfStack_33a8;
  fdb_kvs_handle *pfStack_33a0;
  fdb_file_handle *pfStack_3398;
  fdb_kvs_handle *pfStack_3390;
  undefined1 auStack_3388 [40];
  undefined1 auStack_3360 [40];
  fdb_file_info fStack_3338;
  undefined1 auStack_32f0 [768];
  char acStack_2ff0 [264];
  code *pcStack_2ee8;
  fdb_kvs_handle *pfStack_2ee0;
  fdb_kvs_handle *pfStack_2ed8;
  char *pcStack_2ed0;
  long lStack_2ec8;
  fdb_kvs_handle *pfStack_2ec0;
  fdb_snapshot_info_t *pfStack_2ea8;
  fdb_file_handle *pfStack_2ea0;
  char *pcStack_2e98;
  int iStack_2e8c;
  undefined1 auStack_2e88 [96];
  undefined1 auStack_2e28 [32];
  timeval tStack_2e08;
  fdb_kvs_handle fStack_2df8;
  char acStack_2b58 [256];
  fdb_config fStack_2a58;
  size_t sStack_2960;
  size_t sStack_2958;
  fdb_doc **ppfStack_2950;
  char *pcStack_2948;
  code *pcStack_2940;
  code *pcStack_2938;
  fdb_file_handle *pfStack_2920;
  fdb_snapshot_info_t *pfStack_2918;
  uint64_t uStack_2910;
  uint uStack_2904;
  fdb_kvs_handle *apfStack_2900 [4];
  fdb_kvs_config fStack_28e0;
  char acStack_28c8 [8];
  timeval tStack_28c0;
  char acStack_28b0 [256];
  char acStack_27b0 [256];
  char acStack_26b0 [264];
  fdb_config fStack_25a8;
  fdb_doc *apfStack_24b0 [301];
  fdb_kvs_handle **ppfStack_1b48;
  fdb_doc *pfStack_1b40;
  fdb_kvs_handle *pfStack_1b38;
  fdb_kvs_handle *pfStack_1b30;
  btree *pbStack_1b28;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b08;
  fdb_iterator *pfStack_1b00;
  fdb_kvs_handle *pfStack_1af8;
  undefined1 auStack_1af0 [16];
  undefined1 auStack_1ae0 [40];
  btree bStack_1ab8;
  fdb_kvs_info fStack_1a70;
  fdb_config fStack_1a40;
  char acStack_1948 [256];
  fdb_kvs_handle fStack_1848;
  fdb_kvs_handle **ppfStack_1640;
  fdb_doc *pfStack_1638;
  fdb_kvs_handle *pfStack_1630;
  fdb_kvs_config *pfStack_1628;
  fdb_file_handle **ppfStack_1620;
  fdb_kvs_handle *pfStack_1618;
  fdb_kvs_handle *pfStack_1608;
  fdb_file_handle *pfStack_1600;
  fdb_kvs_config fStack_15f8;
  timeval tStack_15e0;
  fdb_kvs_info fStack_15d0;
  char acStack_15a0 [264];
  fdb_config fStack_1498;
  char acStack_13a0 [256];
  char acStack_12a0 [256];
  fdb_doc *apfStack_11a0 [101];
  fdb_kvs_handle **ppfStack_e78;
  fdb_doc *pfStack_e70;
  fdb_kvs_handle *pfStack_e68;
  fdb_kvs_handle *pfStack_e60;
  btree *pbStack_e58;
  fdb_kvs_handle *pfStack_e50;
  undefined1 auStack_e38 [16];
  fdb_kvs_handle *pfStack_e28;
  fdb_kvs_handle *pfStack_e20;
  btree_kv_ops *pbStack_e18;
  undefined1 auStack_e10 [40];
  docio_handle *pdStack_de8;
  timeval tStack_db0;
  fdb_config fStack_da0;
  fdb_doc afStack_ca8 [3];
  btree abStack_ba8 [14];
  fdb_kvs_handle fStack_888;
  fdb_kvs_handle **ppfStack_580;
  fdb_doc *pfStack_578;
  fdb_kvs_handle *pfStack_570;
  btree *pbStack_568;
  btree *pbStack_560;
  fdb_kvs_handle *pfStack_558;
  fdb_kvs_handle *pfStack_548;
  fdb_kvs_handle *pfStack_540;
  fdb_file_handle *pfStack_538;
  fdb_kvs_handle *pfStack_530;
  fdb_file_handle *pfStack_528;
  undefined1 auStack_520 [32];
  undefined1 auStack_500 [40];
  fdb_file_info fStack_4d8;
  char acStack_490 [264];
  fdb_config fStack_388;
  fdb_kvs_handle fStack_290;
  fdb_doc **ppfStack_88;
  fdb_doc *pfStack_80;
  void *pvStack_78;
  uint64_t uStack_70;
  fdb_file_handle *pfStack_68;
  fdb_kvs_handle *pfStack_60;
  undefined1 local_48 [24];
  
  pfVar14 = (fdb_kvs_handle *)(ulong)status;
  pfStack_60 = (fdb_kvs_handle *)0x10c8af;
  gettimeofday((timeval *)(local_48 + 8),(__timezone_ptr_t)0x0);
  if ((int)status < 8) {
    if (status == 1) {
      *(undefined1 *)((long)ctx + 8) = 1;
      return 0;
    }
    if (status != 2) goto LAB_0010c93f;
    uVar27 = (uint)doc->deleted;
    pfVar14 = (fdb_kvs_handle *)(ulong)uVar27;
    *(int *)ctx = *ctx + 1;
    doc = (fdb_doc *)local_48;
    pfStack_60 = (fdb_kvs_handle *)0x10c8ec;
    fdb_doc_create((fdb_doc **)doc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(local_48._0_8_ + 0x30) = old_offset;
    pfStack_60 = (fdb_kvs_handle *)0x10c8fd;
    fVar4 = fdb_get_byoffset(*(fdb_kvs_handle **)((long)ctx + 0x10),(fdb_doc *)local_48._0_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_60 = (fdb_kvs_handle *)0x10c90f;
      fdb_doc_free((fdb_doc *)local_48._0_8_);
      if ((fhandle->root->config).multi_kv_instances == true) {
        if (*(short *)kv_name == 0x6264) {
          return uVar27;
        }
        pfStack_60 = (fdb_kvs_handle *)0x10c92e;
        compaction_cb();
        goto LAB_0010c92e;
      }
      if (*(int *)(kv_name + 3) == 0x746c7561 && *(int *)kv_name == 0x61666564) {
        return uVar27;
      }
      pfStack_60 = (fdb_kvs_handle *)0x10c9c0;
      compaction_cb();
      goto LAB_0010c9c0;
    }
  }
  else {
LAB_0010c92e:
    if ((int)pfVar14 == 8) {
      *(undefined1 *)((long)ctx + 10) = 1;
      return 0;
    }
    if ((int)pfVar14 == 0x10) {
      *(undefined1 *)((long)ctx + 9) = 1;
      return 0;
    }
LAB_0010c93f:
    *(int *)((long)ctx + 4) = *(int *)((long)ctx + 4) + 1;
    kv_name = local_48;
    pfStack_60 = (fdb_kvs_handle *)0x10c964;
    fdb_doc_create((fdb_doc **)kv_name,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(local_48._0_8_ + 0x30) = old_offset;
    pfStack_60 = (fdb_kvs_handle *)0x10c974;
    fVar4 = fdb_get_byoffset(*(fdb_kvs_handle **)((long)ctx + 0x10),(fdb_doc *)local_48._0_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_60 = (fdb_kvs_handle *)0x10c982;
      fdb_doc_free((fdb_doc *)local_48._0_8_);
      return 0;
    }
LAB_0010c9c0:
    pfStack_60 = (fdb_kvs_handle *)0x10c9c5;
    compaction_cb();
  }
  pfStack_60 = (fdb_kvs_handle *)compact_wo_reopen_test;
  compaction_cb();
  pvStack_78 = ctx;
  pfStack_558 = (fdb_kvs_handle *)0x10c9e7;
  ppfStack_88 = (fdb_doc **)kv_name;
  pfStack_80 = doc;
  uStack_70 = old_offset;
  pfStack_68 = fhandle;
  pfStack_60 = pfVar14;
  gettimeofday((timeval *)(auStack_500 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_558 = (fdb_kvs_handle *)0x10c9ec;
  memleak_start();
  pfStack_558 = (fdb_kvs_handle *)0x10c9f8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_558 = (fdb_kvs_handle *)0x10ca08;
  fdb_get_default_config();
  pbVar6 = (btree *)auStack_500;
  pfStack_558 = (fdb_kvs_handle *)0x10ca15;
  fdb_get_default_kvs_config();
  fStack_388.buffercache_size = 0x1000000;
  fStack_388.wal_threshold = 0x400;
  fStack_388.flags = 1;
  fStack_388.compaction_threshold = '\0';
  pbVar33 = (btree *)&pfStack_538;
  pfStack_558 = (fdb_kvs_handle *)0x10ca47;
  fdb_open((fdb_file_handle **)pbVar33,"./compact_test1",&fStack_388);
  ppfVar18 = &pfStack_540;
  pfStack_558 = (fdb_kvs_handle *)0x10ca5a;
  fdb_kvs_open_default(pfStack_538,ppfVar18,(fdb_kvs_config *)pbVar6);
  pfStack_558 = (fdb_kvs_handle *)0x10ca70;
  fVar4 = fdb_set_log_callback(pfStack_540,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_558 = (fdb_kvs_handle *)0x10ca94;
    fdb_open(&pfStack_528,"./compact_test1",&fStack_388);
    ppfVar18 = &pfStack_530;
    pfStack_558 = (fdb_kvs_handle *)0x10caa9;
    fdb_kvs_open_default(pfStack_528,ppfVar18,(fdb_kvs_config *)auStack_500);
    pfStack_558 = (fdb_kvs_handle *)0x10cabf;
    fVar4 = fdb_set_log_callback(pfStack_530,logCallbackFunc,"compact_wo_reopen_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      lVar28 = 0;
      uVar15 = 0;
      do {
        pfVar1 = &fStack_290.config.encryption_key;
        pfStack_558 = (fdb_kvs_handle *)0x10cae7;
        sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
        pfStack_558 = (fdb_kvs_handle *)0x10caff;
        sprintf((char *)&fStack_290,"meta%d",uVar15 & 0xffffffff);
        pfStack_558 = (fdb_kvs_handle *)0x10cb17;
        sprintf(acStack_490,"body%d",uVar15 & 0xffffffff);
        pbVar33 = (btree *)(auStack_520 + lVar28);
        pfStack_558 = (fdb_kvs_handle *)0x10cb27;
        ctx = (void *)strlen((char *)pfVar1);
        pfVar14 = &fStack_290;
        pfStack_558 = (fdb_kvs_handle *)0x10cb3a;
        pbVar6 = (btree *)strlen((char *)pfVar14);
        pfStack_558 = (fdb_kvs_handle *)0x10cb4a;
        sVar7 = strlen(acStack_490);
        pfStack_558 = (fdb_kvs_handle *)0x10cb6f;
        fdb_doc_create((fdb_doc **)pbVar33,&fStack_290.config.encryption_key,(size_t)ctx,pfVar14,
                       (size_t)pbVar6,acStack_490,sVar7);
        pfStack_558 = (fdb_kvs_handle *)0x10cb7e;
        fdb_set(pfStack_540,*(fdb_doc **)(auStack_520 + uVar15 * 8));
        uVar15 = uVar15 + 1;
        lVar28 = lVar28 + 8;
      } while (uVar15 != 3);
      doc = (fdb_doc *)0x0;
      ppfVar18 = &pfStack_548;
      pfStack_558 = (fdb_kvs_handle *)0x10cbbe;
      fdb_doc_create((fdb_doc **)ppfVar18,
                     *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                      (auStack_520._8_8_ + 0x20),
                     (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_520._8_8_,
                     *(btree_print_func **)(auStack_520._8_8_ + 0x38),
                     (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                              (auStack_520._8_8_ + 8),(void *)0x0,0);
      *(undefined1 *)&pfStack_548->file = 1;
      pfStack_558 = (fdb_kvs_handle *)0x10cbcf;
      fdb_set(pfStack_540,(fdb_doc *)pfStack_548);
      pfStack_558 = (fdb_kvs_handle *)0x10cbd7;
      fdb_doc_free((fdb_doc *)pfStack_548);
      pfStack_558 = (fdb_kvs_handle *)0x10cbe6;
      fdb_commit(pfStack_538,'\x01');
      pfStack_558 = (fdb_kvs_handle *)0x10cbf7;
      fdb_compact(pfStack_538,"./compact_test2");
      while( true ) {
        pfStack_558 = (fdb_kvs_handle *)0x10cc1b;
        fdb_doc_create((fdb_doc **)ppfVar18,(void *)(*(size_t **)(auStack_520 + (long)doc * 8))[4],
                       **(size_t **)(auStack_520 + (long)doc * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_558 = (fdb_kvs_handle *)0x10cc2a;
        fVar4 = fdb_get(pfStack_530,(fdb_doc *)pfStack_548);
        pfVar11 = pfStack_548;
        if (doc != (fdb_doc *)0x1) break;
        pfVar11 = (fdb_kvs_handle *)ctx;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010cd75;
LAB_0010cc8a:
        pfStack_558 = (fdb_kvs_handle *)0x10cc94;
        fdb_doc_free((fdb_doc *)pfStack_548);
        doc = (fdb_doc *)((long)&doc->keylen + 1);
        ctx = pfVar11;
        if (doc == (fdb_doc *)0x3) {
          pfStack_558 = (fdb_kvs_handle *)0x10ccb3;
          fdb_get_file_info(pfStack_528,&fStack_4d8);
          pfStack_558 = (fdb_kvs_handle *)0x10ccc2;
          iVar5 = strcmp("./compact_test2",fStack_4d8.filename);
          if (iVar5 != 0) {
            pfStack_558 = (fdb_kvs_handle *)0x10ccd0;
            compact_wo_reopen_test();
          }
          lVar28 = 0;
          do {
            pfStack_558 = (fdb_kvs_handle *)0x10ccdc;
            fdb_doc_free(*(fdb_doc **)(auStack_520 + lVar28 * 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          pfStack_558 = (fdb_kvs_handle *)0x10ccef;
          fdb_kvs_close(pfStack_540);
          pfStack_558 = (fdb_kvs_handle *)0x10ccf9;
          fdb_kvs_close(pfStack_530);
          pfStack_558 = (fdb_kvs_handle *)0x10cd03;
          fdb_close(pfStack_538);
          pfStack_558 = (fdb_kvs_handle *)0x10cd0d;
          fdb_close(pfStack_528);
          pfStack_558 = (fdb_kvs_handle *)0x10cd12;
          fdb_shutdown();
          pfStack_558 = (fdb_kvs_handle *)0x10cd17;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (compact_wo_reopen_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_558 = (fdb_kvs_handle *)0x10cd48;
          iVar5 = fprintf(_stderr,pcVar23,"compaction without reopen test");
          return iVar5;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar6 = pfStack_548->staletree;
        pfVar14 = *(fdb_kvs_handle **)(auStack_520 + (long)doc * 8);
        pbVar33 = pfVar14->staletree;
        pfStack_558 = (fdb_kvs_handle *)0x10cc63;
        iVar5 = bcmp(pbVar6,pbVar33,(size_t)(pfStack_548->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar6 = (pfVar11->field_6).seqtree;
          pbVar33 = (pfVar14->field_6).seqtree;
          pfStack_558 = (fdb_kvs_handle *)0x10cc82;
          iVar5 = bcmp(pbVar6,pbVar33,(size_t)(pfVar11->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010cc8a;
          pfStack_558 = (fdb_kvs_handle *)0x10cd65;
          compact_wo_reopen_test();
          ctx = pfVar11;
          goto LAB_0010cd65;
        }
      }
      else {
LAB_0010cd65:
        pfVar11 = (fdb_kvs_handle *)ctx;
        pfStack_558 = (fdb_kvs_handle *)0x10cd6a;
        compact_wo_reopen_test();
      }
      pfStack_558 = (fdb_kvs_handle *)0x10cd75;
      compact_wo_reopen_test();
      ctx = pfVar11;
LAB_0010cd75:
      pfStack_558 = (fdb_kvs_handle *)0x10cd7a;
      compact_wo_reopen_test();
      goto LAB_0010cd7a;
    }
  }
  else {
LAB_0010cd7a:
    pfStack_558 = (fdb_kvs_handle *)0x10cd7f;
    compact_wo_reopen_test();
  }
  pfStack_558 = (fdb_kvs_handle *)compact_with_reopen_test;
  compact_wo_reopen_test();
  pfStack_e50 = (fdb_kvs_handle *)0x10cda4;
  ppfStack_580 = ppfVar18;
  pfStack_578 = doc;
  pfStack_570 = (fdb_kvs_handle *)ctx;
  pbStack_568 = pbVar6;
  pbStack_560 = pbVar33;
  pfStack_558 = pfVar14;
  gettimeofday(&tStack_db0,(__timezone_ptr_t)0x0);
  pfStack_e50 = (fdb_kvs_handle *)0x10cda9;
  memleak_start();
  pfStack_e50 = (fdb_kvs_handle *)0x10cdb5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_e50 = (fdb_kvs_handle *)0x10cdc5;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_e10;
  pfStack_e50 = (fdb_kvs_handle *)0x10cdd2;
  fdb_get_default_kvs_config();
  fStack_da0.buffercache_size = 0x1000000;
  fStack_da0.wal_threshold = 0x400;
  fStack_da0.flags = 1;
  fStack_da0.compaction_threshold = '\0';
  pbVar6 = (btree *)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10ce04;
  fdb_open((fdb_file_handle **)pbVar6,"./compact_test1",&fStack_da0);
  ppfVar18 = (fdb_kvs_handle **)(auStack_e38 + 8);
  pfStack_e50 = (fdb_kvs_handle *)0x10ce17;
  fdb_kvs_open_default((fdb_file_handle *)auStack_e38._0_8_,ppfVar18,(fdb_kvs_config *)pfVar11);
  pfStack_e50 = (fdb_kvs_handle *)0x10ce2d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5d7;
  doc = (fdb_doc *)0x0;
  uVar15 = 0;
  do {
    pfVar1 = &fStack_888.config.encryption_key;
    pfStack_e50 = (fdb_kvs_handle *)0x10ce55;
    sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
    pfStack_e50 = (fdb_kvs_handle *)0x10ce6d;
    sprintf((char *)&fStack_888,"meta%d",uVar15 & 0xffffffff);
    pfStack_e50 = (fdb_kvs_handle *)0x10ce85;
    sprintf((char *)afStack_ca8,"body%d",uVar15 & 0xffffffff);
    pbVar6 = (btree *)(&abStack_ba8[0].ksize + (long)doc);
    pfStack_e50 = (fdb_kvs_handle *)0x10ce98;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar1);
    pfVar14 = &fStack_888;
    pfStack_e50 = (fdb_kvs_handle *)0x10ceab;
    sVar7 = strlen((char *)pfVar14);
    pfStack_e50 = (fdb_kvs_handle *)0x10cebb;
    sVar9 = strlen((char *)afStack_ca8);
    pfStack_e50 = (fdb_kvs_handle *)0x10cee0;
    fdb_doc_create((fdb_doc **)pbVar6,&fStack_888.config.encryption_key,(size_t)pfVar8,pfVar14,sVar7
                   ,afStack_ca8,sVar9);
    pfStack_e50 = (fdb_kvs_handle *)0x10cef2;
    fdb_set((fdb_kvs_handle *)auStack_e38._8_8_,*(fdb_doc **)(&abStack_ba8[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    doc = (fdb_doc *)((long)doc + 8);
  } while (uVar15 != 100);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf32;
  fdb_doc_create((fdb_doc **)&pfStack_e28,*(void **)(abStack_ba8[0].root_bid + 0x20),
                 *(size_t *)abStack_ba8[0].root_bid,*(void **)(abStack_ba8[0].root_bid + 0x38),
                 *(size_t *)(abStack_ba8[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&pfStack_e28->file = 1;
  ppfVar18 = (fdb_kvs_handle **)(auStack_e38 + 8);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf46;
  fdb_set((fdb_kvs_handle *)auStack_e38._8_8_,(fdb_doc *)pfStack_e28);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf4e;
  fdb_doc_free((fdb_doc *)pfStack_e28);
  pfVar11 = (fdb_kvs_handle *)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10cf60;
  fdb_commit((fdb_file_handle *)auStack_e38._0_8_,'\x01');
  pfStack_e50 = (fdb_kvs_handle *)0x10cf6f;
  fdb_compact((fdb_file_handle *)auStack_e38._0_8_,"./compact_test2");
  pfStack_e50 = (fdb_kvs_handle *)0x10cf77;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf7f;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10cf8b;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_e50 = (fdb_kvs_handle *)0x10cfa2;
  fdb_open((fdb_file_handle **)pfVar11,"./compact_test1",&fStack_da0);
  pfStack_e50 = (fdb_kvs_handle *)0x10cfb2;
  fdb_kvs_open_default((fdb_file_handle *)auStack_e38._0_8_,ppfVar18,(fdb_kvs_config *)auStack_e10);
  pfStack_e50 = (fdb_kvs_handle *)0x10cfc8;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5dc;
  doc = (fdb_doc *)0x0;
  ctx = pfVar8;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10cfff;
    fdb_doc_create((fdb_doc **)&pfStack_e28,
                   (void *)(*(size_t **)(&abStack_ba8[0].ksize + (long)doc * 8))[4],
                   **(size_t **)(&abStack_ba8[0].ksize + (long)doc * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_e50 = (fdb_kvs_handle *)0x10d00e;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_e38._8_8_,(fdb_doc *)pfStack_e28);
    pfVar8 = pfStack_e28;
    if (doc == (fdb_doc *)0x1) {
      pfVar8 = (fdb_kvs_handle *)ctx;
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d5d2;
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5c2;
      pfVar11 = (fdb_kvs_handle *)pfStack_e28->staletree;
      pfVar14 = *(fdb_kvs_handle **)(&abStack_ba8[0].ksize + (long)doc * 8);
      pbVar6 = pfVar14->staletree;
      pfStack_e50 = (fdb_kvs_handle *)0x10d04a;
      iVar5 = bcmp(pfVar11,pbVar6,(size_t)(pfStack_e28->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010d5c7;
      pfVar11 = (fdb_kvs_handle *)(pfVar8->field_6).seqtree;
      pbVar6 = (pfVar14->field_6).seqtree;
      pfStack_e50 = (fdb_kvs_handle *)0x10d069;
      iVar5 = bcmp(pfVar11,pbVar6,(size_t)(pfVar8->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010d5b7;
    }
    pfStack_e50 = (fdb_kvs_handle *)0x10d07b;
    fdb_doc_free((fdb_doc *)pfStack_e28);
    doc = (fdb_doc *)((long)&doc->keylen + 1);
    ctx = pfVar8;
  } while (doc != (fdb_doc *)0x64);
  pfStack_e50 = (fdb_kvs_handle *)0x10d09a;
  fdb_get_file_info((fdb_file_handle *)auStack_e38._0_8_,(fdb_file_info *)(auStack_e10 + 0x18));
  pfStack_e50 = (fdb_kvs_handle *)0x10d0a9;
  iVar5 = strcmp("./compact_test1",(char *)auStack_e10._24_8_);
  if (iVar5 != 0) {
    pfStack_e50 = (fdb_kvs_handle *)0x10d0b7;
    compact_with_reopen_test();
  }
  pfVar11 = &fStack_888;
  doc = afStack_ca8;
  pfVar8 = (fdb_kvs_handle *)0x0;
  uVar15 = 0;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d0df;
    sprintf((char *)pfVar11,"newmeta%d",uVar15 & 0xffffffff);
    pfStack_e50 = (fdb_kvs_handle *)0x10d0fa;
    sprintf((char *)doc,"newbody%d_%s",uVar15 & 0xffffffff,&fStack_888.bub_ctx.handle);
    pfStack_e50 = (fdb_kvs_handle *)0x10d10d;
    pbVar6 = (btree *)strlen((char *)pfVar11);
    pfStack_e50 = (fdb_kvs_handle *)0x10d118;
    sVar7 = strlen((char *)doc);
    pfStack_e50 = (fdb_kvs_handle *)0x10d12c;
    fdb_doc_update((fdb_doc **)(&abStack_ba8[0].ksize + (long)pfVar8),pfVar11,(size_t)pbVar6,doc,
                   sVar7);
    pfStack_e50 = (fdb_kvs_handle *)0x10d13e;
    fdb_set((fdb_kvs_handle *)auStack_e38._8_8_,*(fdb_doc **)(&abStack_ba8[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    pfVar8 = (fdb_kvs_handle *)((long)pfVar8 + 8);
  } while (uVar15 != 100);
  pfStack_e50 = (fdb_kvs_handle *)0x10d167;
  fdb_open((fdb_file_handle **)&pbStack_e18,"./compact_test1",&fStack_da0);
  ppfVar18 = &pfStack_e20;
  pfStack_e50 = (fdb_kvs_handle *)0x10d17c;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_e18,ppfVar18,(fdb_kvs_config *)auStack_e10);
  pfStack_e50 = (fdb_kvs_handle *)0x10d192;
  fVar4 = fdb_set_log_callback(pfStack_e20,logCallbackFunc,"compact_with_reopen_test");
  pfVar14 = (fdb_kvs_handle *)0x64;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e1;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1a6;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e6;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1ba;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5eb;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1ce;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5f0;
  pfStack_e50 = (fdb_kvs_handle *)0x10d1e0;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d1ea;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfVar8 = (fdb_kvs_handle *)0x0;
  ppfVar18 = &pfStack_e28;
  pfVar19 = pfVar11;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d219;
    fdb_doc_create((fdb_doc **)ppfVar18,
                   (void *)(*(size_t **)(&abStack_ba8[0].ksize + (long)pfVar8 * 8))[4],
                   **(size_t **)(&abStack_ba8[0].ksize + (long)pfVar8 * 8),(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_e50 = (fdb_kvs_handle *)0x10d228;
    fVar4 = fdb_get(pfStack_e20,(fdb_doc *)pfStack_e28);
    pfVar11 = pfStack_e28;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_e50 = (fdb_kvs_handle *)0x10d586;
      compact_with_reopen_test();
LAB_0010d586:
      pfStack_e50 = (fdb_kvs_handle *)0x10d591;
      compact_with_reopen_test();
LAB_0010d591:
      pfStack_e50 = (fdb_kvs_handle *)0x10d59c;
      compact_with_reopen_test();
      goto LAB_0010d59c;
    }
    pbVar6 = pfStack_e28->staletree;
    pfVar14 = *(fdb_kvs_handle **)(&abStack_ba8[0].ksize + (long)pfVar8 * 8);
    doc = (fdb_doc *)pfVar14->staletree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d254;
    iVar5 = bcmp(pbVar6,doc,(size_t)(pfStack_e28->kvs_config).custom_cmp);
    pfVar19 = pfVar11;
    if (iVar5 != 0) goto LAB_0010d586;
    pbVar6 = (pfVar11->field_6).seqtree;
    doc = (fdb_doc *)(pfVar14->field_6).seqtree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d273;
    iVar5 = bcmp(pbVar6,doc,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d591;
    pfStack_e50 = (fdb_kvs_handle *)0x10d283;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x64);
  pfStack_e50 = (fdb_kvs_handle *)0x10d2a9;
  fVar4 = fdb_open((fdb_file_handle **)auStack_e38,"./compact_test1",&fStack_da0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5f5;
  pfStack_e50 = (fdb_kvs_handle *)0x10d2c5;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_e38._0_8_,(fdb_kvs_handle **)(auStack_e38 + 8),
                     (fdb_kvs_config *)auStack_e10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5fa;
  pfStack_e50 = (fdb_kvs_handle *)0x10d2e5;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5ff;
  pfStack_e50 = (fdb_kvs_handle *)0x10d2ff;
  fdb_get_file_info((fdb_file_handle *)auStack_e38._0_8_,(fdb_file_info *)(auStack_e10 + 0x18));
  pfStack_e50 = (fdb_kvs_handle *)0x10d30e;
  iVar5 = strcmp("./compact_test1.3",(char *)auStack_e10._24_8_);
  if (iVar5 != 0) {
    pfStack_e50 = (fdb_kvs_handle *)0x10d31c;
    compact_with_reopen_test();
  }
  pfStack_e50 = (fdb_kvs_handle *)0x10d326;
  fdb_kvs_close(pfStack_e20);
  pfStack_e50 = (fdb_kvs_handle *)0x10d330;
  fdb_close((fdb_file_handle *)pbStack_e18);
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_e50 = (fdb_kvs_handle *)0x10d35f;
    fdb_doc_create((fdb_doc **)&pfStack_e28,
                   (void *)(*(size_t **)(&abStack_ba8[0].ksize + (long)pfVar8 * 8))[4],
                   **(size_t **)(&abStack_ba8[0].ksize + (long)pfVar8 * 8),(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_e50 = (fdb_kvs_handle *)0x10d36e;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_e38._8_8_,(fdb_doc *)pfStack_e28);
    pfVar11 = pfStack_e28;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d59c;
    pbVar6 = pfStack_e28->staletree;
    pfVar14 = *(fdb_kvs_handle **)(&abStack_ba8[0].ksize + (long)pfVar8 * 8);
    doc = (fdb_doc *)pfVar14->staletree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d39a;
    iVar5 = bcmp(pbVar6,doc,(size_t)(pfStack_e28->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0010d5a1;
    pbVar6 = (pfVar11->field_6).seqtree;
    doc = (fdb_doc *)(pfVar14->field_6).seqtree;
    pfStack_e50 = (fdb_kvs_handle *)0x10d3b9;
    iVar5 = bcmp(pbVar6,doc,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5ac;
    pfStack_e50 = (fdb_kvs_handle *)0x10d3c9;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
    pfVar19 = pfVar11;
  } while (pfVar8 != (fdb_kvs_handle *)0x64);
  ppfVar18 = (fdb_kvs_handle **)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10d3e5;
  fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  pfVar11 = (fdb_kvs_handle *)(auStack_e38 + 8);
  pfStack_e50 = (fdb_kvs_handle *)0x10d3f2;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d3fa;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d406;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_e50 = (fdb_kvs_handle *)0x10d41d;
  fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&fStack_da0);
  pfStack_e50 = (fdb_kvs_handle *)0x10d42d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_e38._0_8_,(fdb_kvs_handle **)pfVar11,
             (fdb_kvs_config *)auStack_e10);
  pfStack_e50 = (fdb_kvs_handle *)0x10d443;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d604;
  ppfVar18 = (fdb_kvs_handle **)auStack_e38;
  pfStack_e50 = (fdb_kvs_handle *)0x10d45a;
  fdb_compact((fdb_file_handle *)auStack_e38._0_8_,(char *)0x0);
  pfStack_e50 = (fdb_kvs_handle *)0x10d464;
  fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d46c;
  fdb_close((fdb_file_handle *)auStack_e38._0_8_);
  pfStack_e50 = (fdb_kvs_handle *)0x10d483;
  fVar4 = fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&fStack_da0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d609;
  pfStack_e50 = (fdb_kvs_handle *)0x10d49f;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_e38._0_8_,(fdb_kvs_handle **)(auStack_e38 + 8),
                     (fdb_kvs_config *)auStack_e10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d60e;
  pfStack_e50 = (fdb_kvs_handle *)0x10d4bf;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_e38._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_e50 = (fdb_kvs_handle *)0x10d4d9;
    fdb_get_file_info((fdb_file_handle *)auStack_e38._0_8_,(fdb_file_info *)(auStack_e10 + 0x18));
    pfStack_e50 = (fdb_kvs_handle *)0x10d4e8;
    iVar5 = strcmp("./compact_test.fdb",(char *)auStack_e10._24_8_);
    if (iVar5 != 0) {
      pfStack_e50 = (fdb_kvs_handle *)0x10d4f6;
      compact_with_reopen_test();
    }
    if (pdStack_de8 != (docio_handle *)0x64) {
      pfStack_e50 = (fdb_kvs_handle *)0x10d508;
      compact_with_reopen_test();
    }
    lVar28 = 0;
    do {
      pfStack_e50 = (fdb_kvs_handle *)0x10d517;
      fdb_doc_free(*(fdb_doc **)(&abStack_ba8[0].ksize + lVar28 * 8));
      lVar28 = lVar28 + 1;
    } while (lVar28 != 100);
    pfStack_e50 = (fdb_kvs_handle *)0x10d52a;
    fdb_kvs_close((fdb_kvs_handle *)auStack_e38._8_8_);
    pfStack_e50 = (fdb_kvs_handle *)0x10d534;
    fdb_close((fdb_file_handle *)auStack_e38._0_8_);
    pfStack_e50 = (fdb_kvs_handle *)0x10d539;
    fdb_shutdown();
    pfStack_e50 = (fdb_kvs_handle *)0x10d53e;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_e50 = (fdb_kvs_handle *)0x10d56f;
    iVar5 = fprintf(_stderr,pcVar23,"compaction with reopen test");
    return iVar5;
  }
  goto LAB_0010d613;
LAB_0010eacf:
  pfStack_2ec0 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
  goto LAB_0010ead4;
LAB_001107eb:
  pfStack_18648 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar14 = pfVar22;
LAB_001107f6:
  pfVar22 = pfVar14;
  pfStack_18648 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_18648 = (fdb_kvs_handle *)0x110806;
  pcVar23 = (char *)pfVar8;
  compaction_daemon_test();
  pfVar14 = pfVar22;
LAB_00110806:
  _Var35._M_i = (__int_type_conflict)apfStack_18440;
  pcVar20 = "key%04d";
  pfStack_18648 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_0010d59c:
  pfVar11 = pfVar19;
  pfStack_e50 = (fdb_kvs_handle *)0x10d5a1;
  compact_with_reopen_test();
LAB_0010d5a1:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5ac;
  compact_with_reopen_test();
LAB_0010d5ac:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5b7;
  compact_with_reopen_test();
LAB_0010d5b7:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5c2;
  compact_with_reopen_test();
  ctx = pfVar8;
LAB_0010d5c2:
  pfVar8 = (fdb_kvs_handle *)ctx;
  pfStack_e50 = (fdb_kvs_handle *)0x10d5c7;
  compact_with_reopen_test();
LAB_0010d5c7:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5d2;
  compact_with_reopen_test();
  ctx = pfVar8;
LAB_0010d5d2:
  ppfVar18 = &pfStack_e28;
  pfStack_e50 = (fdb_kvs_handle *)0x10d5d7;
  compact_with_reopen_test();
LAB_0010d5d7:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5dc;
  compact_with_reopen_test();
  pfVar8 = (fdb_kvs_handle *)ctx;
LAB_0010d5dc:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5e1;
  compact_with_reopen_test();
LAB_0010d5e1:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5e6;
  compact_with_reopen_test();
LAB_0010d5e6:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5eb;
  compact_with_reopen_test();
LAB_0010d5eb:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5f5;
  compact_with_reopen_test();
LAB_0010d5f5:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5fa;
  compact_with_reopen_test();
LAB_0010d5fa:
  pfStack_e50 = (fdb_kvs_handle *)0x10d5ff;
  compact_with_reopen_test();
LAB_0010d5ff:
  pfStack_e50 = (fdb_kvs_handle *)0x10d604;
  compact_with_reopen_test();
LAB_0010d604:
  pfStack_e50 = (fdb_kvs_handle *)0x10d609;
  compact_with_reopen_test();
LAB_0010d609:
  pfStack_e50 = (fdb_kvs_handle *)0x10d60e;
  compact_with_reopen_test();
LAB_0010d60e:
  pfStack_e50 = (fdb_kvs_handle *)0x10d613;
  compact_with_reopen_test();
LAB_0010d613:
  pfStack_e50 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_1618 = (fdb_kvs_handle *)0x10d635;
  ppfStack_e78 = ppfVar18;
  pfStack_e70 = doc;
  pfStack_e68 = pfVar8;
  pfStack_e60 = pfVar11;
  pbStack_e58 = pbVar6;
  pfStack_e50 = pfVar14;
  gettimeofday(&tStack_15e0,(__timezone_ptr_t)0x0);
  pfStack_1618 = (fdb_kvs_handle *)0x10d63a;
  memleak_start();
  pfStack_1618 = (fdb_kvs_handle *)0x10d646;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1618 = (fdb_kvs_handle *)0x10d656;
  fdb_get_default_config();
  pfStack_1618 = (fdb_kvs_handle *)0x10d663;
  fdb_get_default_kvs_config();
  fStack_1498.wal_threshold = 0x400;
  fStack_1498.flags = 1;
  fStack_1498.compaction_threshold = '\0';
  pfStack_1618 = (fdb_kvs_handle *)0x10d68d;
  fdb_open(&pfStack_1600,"./compact_test1",&fStack_1498);
  pfStack_1618 = (fdb_kvs_handle *)0x10d6a7;
  fdb_kvs_open(pfStack_1600,&pfStack_1608,"db",&fStack_15f8);
  pfStack_1618 = (fdb_kvs_handle *)0x10d6bd;
  fVar4 = fdb_set_log_callback(pfStack_1608,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar15 = 0;
    do {
      pfStack_1618 = (fdb_kvs_handle *)0x10d6e5;
      sprintf(acStack_12a0,"key%d",uVar15 & 0xffffffff);
      pfStack_1618 = (fdb_kvs_handle *)0x10d6fd;
      sprintf(acStack_13a0,"meta%d",uVar15 & 0xffffffff);
      pfStack_1618 = (fdb_kvs_handle *)0x10d712;
      sprintf(acStack_15a0,"body%d",uVar15 & 0xffffffff);
      pfStack_1618 = (fdb_kvs_handle *)0x10d725;
      sVar7 = strlen(acStack_12a0);
      pfStack_1618 = (fdb_kvs_handle *)0x10d738;
      sVar9 = strlen(acStack_13a0);
      pfStack_1618 = (fdb_kvs_handle *)0x10d745;
      sVar10 = strlen(acStack_15a0);
      pfStack_1618 = (fdb_kvs_handle *)0x10d767;
      fdb_doc_create((fdb_doc **)((long)apfStack_11a0 + lVar28),acStack_12a0,sVar7,acStack_13a0,
                     sVar9,acStack_15a0,sVar10);
      pfStack_1618 = (fdb_kvs_handle *)0x10d779;
      fdb_set(pfStack_1608,apfStack_11a0[uVar15]);
      uVar15 = uVar15 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar15 != 100);
    pfStack_1618 = (fdb_kvs_handle *)0x10d799;
    fdb_commit(pfStack_1600,'\0');
    pfStack_1618 = (fdb_kvs_handle *)0x10d7a3;
    fdb_compact(pfStack_1600,(char *)0x0);
    pfStack_1618 = (fdb_kvs_handle *)0x10d7b9;
    fdb_get_kvs_info(pfStack_1608,&fStack_15d0);
    lVar28 = (long)(int)fStack_15d0.doc_count;
    pfStack_1618 = (fdb_kvs_handle *)0x10d7c6;
    fdb_kvs_close(pfStack_1608);
    pfStack_1618 = (fdb_kvs_handle *)0x10d7ce;
    fdb_close(pfStack_1600);
    pfStack_1618 = (fdb_kvs_handle *)0x10d7e5;
    fdb_open(&pfStack_1600,"./compact_test1",&fStack_1498);
    pfStack_1618 = (fdb_kvs_handle *)0x10d7fc;
    fdb_kvs_open(pfStack_1600,&pfStack_1608,"db",&fStack_15f8);
    pfStack_1618 = (fdb_kvs_handle *)0x10d808;
    fdb_get_kvs_info(pfStack_1608,&fStack_15d0);
    if (lVar28 != CONCAT44(fStack_15d0.doc_count._4_4_,(int)fStack_15d0.doc_count)) {
      pfStack_1618 = (fdb_kvs_handle *)0x10d81b;
      compact_reopen_named_kvs();
    }
    pfStack_1618 = (fdb_kvs_handle *)0x10d825;
    fdb_kvs_close(pfStack_1608);
    pfStack_1618 = (fdb_kvs_handle *)0x10d82f;
    fdb_close(pfStack_1600);
    lVar28 = 0;
    do {
      pfStack_1618 = (fdb_kvs_handle *)0x10d83e;
      fdb_doc_free(apfStack_11a0[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 100);
    pfStack_1618 = (fdb_kvs_handle *)0x10d84c;
    fdb_shutdown();
    pfStack_1618 = (fdb_kvs_handle *)0x10d851;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_1618 = (fdb_kvs_handle *)0x10d882;
    iVar5 = fprintf(_stderr,pcVar23,"compact reopen named kvs");
    return iVar5;
  }
  pfStack_1618 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8b6;
  ppfStack_1640 = &pfStack_1608;
  pfStack_1638 = doc;
  pfStack_1630 = pfVar8;
  pfStack_1628 = &fStack_15f8;
  ppfStack_1620 = &pfStack_1600;
  pfStack_1618 = pfVar14;
  gettimeofday((timeval *)(auStack_1ae0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8bb;
  memleak_start();
  pfStack_1af8 = (fdb_kvs_handle *)0x0;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8d0;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8e0;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_1ae0;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d8ed;
  fdb_get_default_kvs_config();
  fStack_1a40.wal_threshold = 0x400;
  fStack_1a40.flags = 1;
  fStack_1a40.compaction_threshold = '\0';
  pbVar6 = (btree *)auStack_1af0;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d917;
  fdb_open((fdb_file_handle **)pbVar6,"./compact_test1",&fStack_1a40);
  ppfVar18 = &pfStack_1b08;
  pfStack_1b20 = (fdb_kvs_handle *)0x10d931;
  fdb_kvs_open((fdb_file_handle *)auStack_1af0._0_8_,ppfVar18,"db",(fdb_kvs_config *)pfVar11);
  pfStack_1b20 = (fdb_kvs_handle *)0x10d947;
  pfVar19 = pfStack_1b08;
  fVar4 = fdb_set_log_callback(pfStack_1b08,logCallbackFunc,"compact_reopen_with_iterator");
  uVar27 = (uint)pfVar19;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    doc = (fdb_doc *)0x0;
    uVar15 = 0;
    do {
      pfVar1 = &fStack_1848.config.encryption_key;
      pfStack_1b20 = (fdb_kvs_handle *)0x10d96f;
      sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d987;
      sprintf((char *)&fStack_1848,"meta%d",uVar15 & 0xffffffff);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d99f;
      sprintf(acStack_1948,"body%d",uVar15 & 0xffffffff);
      pbVar6 = (btree *)(&bStack_1ab8.ksize + (long)doc);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9af;
      pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar1);
      pfVar14 = &fStack_1848;
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9c2;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar14);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9d2;
      sVar7 = strlen(acStack_1948);
      pfStack_1b20 = (fdb_kvs_handle *)0x10d9f7;
      fdb_doc_create((fdb_doc **)pbVar6,&fStack_1848.config.encryption_key,(size_t)pfVar8,pfVar14,
                     (size_t)pfVar11,acStack_1948,sVar7);
      pfStack_1b20 = (fdb_kvs_handle *)0x10da06;
      fdb_set(pfStack_1b08,*(fdb_doc **)(&bStack_1ab8.ksize + uVar15 * 8));
      uVar15 = uVar15 + 1;
      doc = (fdb_doc *)((long)doc + 8);
    } while (uVar15 != 9);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da23;
    fdb_commit((fdb_file_handle *)auStack_1af0._0_8_,'\0');
    ppfVar18 = (fdb_kvs_handle **)(auStack_1af0 + 8);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da3f;
    fdb_open((fdb_file_handle **)ppfVar18,"./compact_test1",&fStack_1a40);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da4e;
    pfVar24 = (fdb_file_handle *)auStack_1af0._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_1af0._8_8_,"./compact_test2");
    uVar27 = (uint)pfVar24;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dc71;
    pfStack_1b20 = (fdb_kvs_handle *)0x10da60;
    fdb_close((fdb_file_handle *)auStack_1af0._8_8_);
    pfStack_1b20 = (fdb_kvs_handle *)0x10da80;
    pfVar19 = pfStack_1b08;
    fVar4 = fdb_iterator_init(pfStack_1b08,&pfStack_1b00,(void *)0x0,0,(void *)0x0,0,0);
    uVar27 = (uint)pfVar19;
    pfVar19 = pfVar11;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dc76;
    pfVar8 = (fdb_kvs_handle *)0x0;
    ppfVar18 = &pfStack_1af8;
    do {
      pfStack_1b20 = (fdb_kvs_handle *)0x10da9d;
      fVar4 = fdb_iterator_get(pfStack_1b00,(fdb_doc **)ppfVar18);
      pfVar19 = pfStack_1af8;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0010dc51:
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc56;
        compact_reopen_with_iterator();
LAB_0010dc56:
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc61;
        compact_reopen_with_iterator();
LAB_0010dc61:
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc6c;
        pfVar26 = doc;
        compact_reopen_with_iterator();
        uVar27 = (uint)pfVar26;
        goto LAB_0010dc6c;
      }
      pbVar6 = (btree *)pfStack_1af8->op_stats;
      pfVar14 = *(fdb_kvs_handle **)(&bStack_1ab8.ksize + (long)pfVar8 * 8);
      doc = (fdb_doc *)pfVar14->op_stats;
      pfStack_1b20 = (fdb_kvs_handle *)0x10dac5;
      iVar5 = bcmp(pbVar6,doc,*(size_t *)&pfStack_1af8->kvs_config);
      pfVar11 = pfVar19;
      if (iVar5 != 0) {
        pfStack_1b20 = (fdb_kvs_handle *)0x10dc51;
        compact_reopen_with_iterator();
        goto LAB_0010dc51;
      }
      pbVar6 = pfVar19->staletree;
      doc = (fdb_doc *)pfVar14->staletree;
      pfStack_1b20 = (fdb_kvs_handle *)0x10dae4;
      iVar5 = bcmp(pbVar6,doc,(size_t)(pfVar19->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010dc61;
      pbVar6 = (pfVar19->field_6).seqtree;
      doc = (fdb_doc *)(pfVar14->field_6).seqtree;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db03;
      iVar5 = bcmp(pbVar6,doc,(size_t)(pfVar19->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010dc56;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db13;
      fdb_doc_free((fdb_doc *)pfVar19);
      pfStack_1af8 = (fdb_kvs_handle *)0x0;
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db29;
      pfVar25 = pfStack_1b00;
      fVar4 = fdb_iterator_next(pfStack_1b00);
      uVar27 = (uint)pfVar25;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)pfVar8 != 9) goto LAB_0010dc7b;
    pfStack_1b20 = (fdb_kvs_handle *)0x10db46;
    fVar4 = fdb_iterator_close(pfStack_1b00);
    uVar27 = (uint)pfStack_1b00;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_1b20 = (fdb_kvs_handle *)0x10db66;
      fdb_get_kvs_info(pfStack_1b08,&fStack_1a70);
      lVar28 = (long)(int)fStack_1a70.doc_count;
      pfStack_1b20 = (fdb_kvs_handle *)0x10db72;
      fdb_kvs_close(pfStack_1b08);
      pfStack_1b20 = (fdb_kvs_handle *)0x10db80;
      fdb_close((fdb_file_handle *)auStack_1af0._0_8_);
      pfStack_1b20 = (fdb_kvs_handle *)0x10db97;
      fdb_open((fdb_file_handle **)auStack_1af0,"./compact_test2",&fStack_1a40);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbaf;
      fdb_kvs_open((fdb_file_handle *)auStack_1af0._0_8_,&pfStack_1b08,"db",
                   (fdb_kvs_config *)auStack_1ae0);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbba;
      fdb_get_kvs_info(pfStack_1b08,&fStack_1a70);
      if (lVar28 != CONCAT44(fStack_1a70.doc_count._4_4_,(int)fStack_1a70.doc_count)) {
        pfStack_1b20 = (fdb_kvs_handle *)0x10dbd0;
        compact_reopen_with_iterator();
      }
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbda;
      fdb_kvs_close(pfStack_1b08);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbe4;
      fdb_close((fdb_file_handle *)auStack_1af0._0_8_);
      lVar28 = 0;
      do {
        pfStack_1b20 = (fdb_kvs_handle *)0x10dbf0;
        fdb_doc_free(*(fdb_doc **)(&bStack_1ab8.ksize + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 9);
      pfStack_1b20 = (fdb_kvs_handle *)0x10dbfe;
      fdb_shutdown();
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc03;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_1b20 = (fdb_kvs_handle *)0x10dc34;
      iVar5 = fprintf(_stderr,pcVar23,"compact reopen with iterator");
      return iVar5;
    }
  }
  else {
LAB_0010dc6c:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dc71;
    compact_reopen_with_iterator();
LAB_0010dc71:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dc76;
    compact_reopen_with_iterator();
    pfVar19 = pfVar11;
LAB_0010dc76:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dc7b;
    compact_reopen_with_iterator();
LAB_0010dc7b:
    pfStack_1b20 = (fdb_kvs_handle *)0x10dc80;
    compact_reopen_with_iterator();
  }
  pfStack_1b20 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_2938 = (code *)0x10dca7;
  ppfStack_1b48 = ppfVar18;
  pfStack_1b40 = doc;
  pfStack_1b38 = pfVar8;
  pfStack_1b30 = pfVar19;
  pbStack_1b28 = pbVar6;
  pfStack_1b20 = pfVar14;
  gettimeofday(&tStack_28c0,(__timezone_ptr_t)0x0);
  pcStack_2938 = (code *)0x10dcac;
  memleak_start();
  pcStack_2938 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_2938 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  fStack_25a8.buffercache_size = 0;
  fStack_25a8.wal_threshold = 0x32;
  fStack_25a8.flags = 1;
  fStack_25a8.compaction_threshold = '\0';
  fStack_25a8.block_reusing_threshold = 0;
  pcStack_2938 = (code *)0x10dcf4;
  fStack_25a8.multi_kv_instances = (bool)(char)uVar27;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_2938 = (code *)0x10dd08;
  fdb_open(&pfStack_2920,"./compact_test1",&fStack_25a8);
  uStack_2904 = uVar27;
  if (uVar27 == 0) {
    pcStack_2938 = (code *)0x10dd74;
    fdb_kvs_open_default(pfStack_2920,apfStack_2900,&fStack_28e0);
    sVar16 = 1;
  }
  else {
    ppfVar18 = apfStack_2900;
    uVar15 = 0;
    do {
      pcStack_2938 = (code *)0x10dd39;
      sprintf(acStack_28c8,"kv%d",uVar15 & 0xffffffff);
      pcStack_2938 = (code *)0x10dd4c;
      fdb_kvs_open(pfStack_2920,ppfVar18,acStack_28c8,&fStack_28e0);
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    sVar16 = 4;
  }
  uVar15 = 0;
  do {
    pcStack_2938 = (code *)0x10dd98;
    sprintf(acStack_26b0,"key%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10ddb1;
    sprintf(acStack_27b0,"meta%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10ddca;
    sprintf(acStack_28b0,"body%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10dddd;
    sVar7 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10ddf0;
    sVar9 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10de00;
    sVar10 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10de25;
    fdb_doc_create(apfStack_24b0 + uVar15,acStack_26b0,sVar7,acStack_27b0,sVar9,acStack_28b0,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10de36;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x4b);
  pcStack_2938 = (code *)0x10de5a;
  fdb_commit(pfStack_2920,'\x01');
  uVar15 = 0x4b;
  do {
    pcStack_2938 = (code *)0x10de7c;
    sprintf(acStack_26b0,"key%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10de95;
    sprintf(acStack_27b0,"meta%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10deae;
    sprintf(acStack_28b0,"body%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10dec1;
    sVar7 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10ded4;
    sVar9 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10dee4;
    sVar10 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10df09;
    fdb_doc_create(apfStack_24b0 + uVar15,acStack_26b0,sVar7,acStack_27b0,sVar9,acStack_28b0,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10df1a;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x96);
  lVar28 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10df4a;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[lVar28]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x4b);
  lVar28 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10df73;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[lVar28]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x4b);
  pcStack_2938 = (code *)0x10df90;
  fdb_commit(pfStack_2920,'\0');
  uVar15 = 0x96;
  do {
    pcStack_2938 = (code *)0x10dfb2;
    sprintf(acStack_26b0,"key%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10dfcb;
    sprintf(acStack_27b0,"meta%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10dfe4;
    sprintf(acStack_28b0,"body%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10dff7;
    sVar7 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10e00a;
    sVar9 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10e01a;
    sVar10 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10e03f;
    fdb_doc_create(apfStack_24b0 + uVar15,acStack_26b0,sVar7,acStack_27b0,sVar9,acStack_28b0,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10e050;
      fdb_set(apfStack_2900[sVar32],apfStack_24b0[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xe1);
  pcStack_2938 = (code *)0x10e077;
  fdb_commit(pfStack_2920,'\x01');
  uVar15 = 0xe1;
  do {
    pcStack_2938 = (code *)0x10e099;
    sprintf(acStack_26b0,"key%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10e0b2;
    sprintf(acStack_27b0,"meta%d",uVar15 & 0xffffffff);
    pcStack_2938 = (code *)0x10e0cb;
    sprintf(acStack_28b0,"body%d",uVar15 & 0xffffffff);
    ppfVar34 = apfStack_24b0 + uVar15;
    pcStack_2938 = (code *)0x10e0de;
    sVar7 = strlen(acStack_26b0);
    pcStack_2938 = (code *)0x10e0f1;
    sVar9 = strlen(acStack_27b0);
    pcStack_2938 = (code *)0x10e101;
    sVar10 = strlen(acStack_28b0);
    pcStack_2938 = (code *)0x10e126;
    fdb_doc_create(ppfVar34,acStack_26b0,sVar7,acStack_27b0,sVar9,acStack_28b0,sVar10);
    sVar32 = 0;
    do {
      pcStack_2938 = (code *)0x10e137;
      fdb_set(apfStack_2900[sVar32],*ppfVar34);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 300);
  sVar32 = 0;
  pcStack_2938 = (code *)0x10e15e;
  fdb_commit(pfStack_2920,'\0');
  do {
    pfVar14 = apfStack_2900[sVar32];
    pcStack_2938 = (code *)0x10e17c;
    fVar4 = fdb_set_log_callback(pfVar14,logCallbackFunc,"estimate_space_upto_test");
    iVar5 = (int)pfVar14;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_2938 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar32 = sVar32 + 1;
  } while (sVar16 != sVar32);
  pcStack_2938 = (code *)0x10e1a0;
  pfVar24 = pfStack_2920;
  fVar4 = fdb_get_all_snap_markers(pfStack_2920,&pfStack_2918,&uStack_2910);
  iVar5 = (int)pfVar24;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    sVar7 = (size_t)uStack_2904;
    cVar21 = (char)uStack_2904;
    uVar13 = uStack_2910;
    if (cVar21 != '\0') {
      if (uStack_2910 != 8) {
        pcStack_2938 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_2938 = (code *)0x10e1d9;
      sVar16 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[1].marker);
      pcStack_2938 = (code *)0x10e1ef;
      sVar12 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[2].marker);
      if (sVar12 <= sVar16) {
        pcStack_2938 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar13 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_2938 = (code *)0x10e24a;
      fVar4 = fdb_free_snap_markers(pfStack_2918,uStack_2910);
      iVar5 = (int)pfStack_2918;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcStack_2938 = (code *)0x10e25c;
        fdb_close(pfStack_2920);
        lVar28 = 0;
        do {
          pcStack_2938 = (code *)0x10e26b;
          fdb_doc_free(apfStack_24b0[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 300);
        pcStack_2938 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_2938 = (code *)0x10e281;
        memleak_end();
        pcVar23 = "single kv mode:";
        if (cVar21 != '\0') {
          pcVar23 = "multiple kv mode:";
        }
        pcStack_2938 = (code *)0x10e2af;
        sprintf(acStack_28b0,"estimate space upto marker in file test %s",pcVar23);
        pcVar23 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStack_2938 = (code *)0x10e2dc;
        iVar5 = fprintf(_stderr,pcVar23,acStack_28b0);
        return iVar5;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar13 != 4) {
      pcStack_2938 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_2938 = (code *)0x10e21c;
    sVar16 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[1].marker);
    pcStack_2938 = (code *)0x10e232;
    pfVar24 = pfStack_2920;
    sVar12 = fdb_estimate_space_used_from(pfStack_2920,pfStack_2918[2].marker);
    iVar5 = (int)pfVar24;
    if (sVar16 < sVar12) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_2938 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_2938 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_2938 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_2940 = logCallbackFunc;
  pcStack_2948 = "estimate_space_upto_test";
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e327;
  sStack_2960 = sVar16;
  sStack_2958 = sVar32;
  ppfStack_2950 = ppfVar34;
  pcStack_2938 = (code *)sVar7;
  gettimeofday(&tStack_2e08,(__timezone_ptr_t)0x0);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_2a58.buffercache_size = 0;
  fStack_2a58.wal_threshold = 0x400;
  fStack_2a58.flags = 1;
  fStack_2a58.compaction_threshold = '\0';
  fStack_2a58.block_reusing_threshold = 0;
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e374;
  fStack_2a58.multi_kv_instances = (bool)(char)iVar5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_2ea0,"./compact_test1",&fStack_2a58);
  iStack_2e8c = iVar5;
  if (iVar5 == 0) {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_2ea0,(fdb_kvs_handle **)(auStack_2e88 + 0x20),
               (fdb_kvs_config *)(auStack_2e88 + 0x48));
    uVar27 = 1;
  }
  else {
    ppfVar18 = (fdb_kvs_handle **)(auStack_2e88 + 0x20);
    uVar15 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_2e88,"kv%d",uVar15 & 0xffffffff);
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_2ea0,ppfVar18,auStack_2e88,(fdb_kvs_config *)(auStack_2e88 + 0x48));
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    uVar27 = 4;
  }
  pfVar14 = (fdb_kvs_handle *)(ulong)uVar27;
  uVar15 = 0;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_2df8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_2df8.config.compaction_minimum_filesize,"meta%d",uVar15 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_2b58,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_2df8.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e45f;
    sVar7 = strlen((char *)&fStack_2df8.kv_info_offset);
    puVar2 = &fStack_2df8.config.compaction_minimum_filesize;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e472;
    sVar9 = strlen((char *)puVar2);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e482;
    sVar10 = strlen(acStack_2b58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_2df8.kv_info_offset,sVar7,puVar2,sVar9,acStack_2b58,
                   sVar10);
    lVar28 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_2ea0,'\x01');
  uVar15 = 5;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_2df8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_2df8.config.compaction_minimum_filesize;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_2b58,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_2df8.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e549;
    sVar7 = strlen((char *)&fStack_2df8.kv_info_offset);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e554;
    sVar9 = strlen((char *)puVar2);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e55f;
    sVar10 = strlen(acStack_2b58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_2df8.kv_info_offset,sVar7,
                   &fStack_2df8.config.compaction_minimum_filesize,sVar9,acStack_2b58,sVar10);
    lVar28 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_2ea0,'\0');
  uVar15 = 10;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_2df8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_2df8.config.compaction_minimum_filesize;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_2b58,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_2df8.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e622;
    sVar7 = strlen((char *)&fStack_2df8.kv_info_offset);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e62d;
    sVar9 = strlen((char *)puVar2);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e638;
    sVar10 = strlen(acStack_2b58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_2df8.kv_info_offset,sVar7,
                   &fStack_2df8.config.compaction_minimum_filesize,sVar9,acStack_2b58,sVar10);
    lVar28 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xf);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_2ea0,'\x01');
  uVar15 = 0xf;
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_2df8.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_2df8.config.compaction_minimum_filesize;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_2b58,"body%d",uVar15 & 0xffffffff);
    pfVar11 = (fdb_kvs_handle *)(&fStack_2df8.kvs_config.create_if_missing + uVar15 * 8);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e6fe;
    sVar7 = strlen((char *)&fStack_2df8.kv_info_offset);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e709;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)puVar2);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e714;
    sVar9 = strlen(acStack_2b58);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)pfVar11,&fStack_2df8.kv_info_offset,sVar7,
                   &fStack_2df8.config.compaction_minimum_filesize,(size_t)pfVar8,acStack_2b58,sVar9
                  );
    lVar28 = 0;
    do {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e88 + lVar28 * 8 + 0x20),
              *(fdb_doc **)&pfVar11->kvs_config);
      lVar28 = lVar28 + 1;
    } while (pfVar14 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x14);
  lVar28 = 0;
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_2ea0,'\0');
  __s = logCallbackFunc;
  pcVar23 = "compact_upto_test";
  do {
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e78b;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2e88 + lVar28 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar28 = lVar28 + 1;
  } while (pfVar14 != (fdb_kvs_handle *)lVar28);
  pfStack_2ec0 = (fdb_kvs_handle *)0x10e7af;
  fVar4 = fdb_get_all_snap_markers(pfStack_2ea0,&pfStack_2ea8,(uint64_t *)&pcStack_2e98);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_2e8c == '\0') {
      if (pcStack_2e98 != (char *)0x4) {
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e8c9;
        compact_upto_test();
      }
      if (pcStack_2e98 != (char *)0x0) {
        lVar28 = 0x1400000000;
        pfVar8 = (fdb_kvs_handle *)0x0;
        pfVar11 = (fdb_kvs_handle *)0xfffffffb00000000;
        pcVar23 = (char *)0x0;
        do {
          if (*(long *)((long)&pfStack_2ea8->num_kvs_markers + (long)pfVar8) != 1) {
            pfStack_2ec0 = (fdb_kvs_handle *)0x10eab6;
            compact_upto_test();
          }
          if (*(long *)(*(long *)((long)&pfStack_2ea8->kvs_markers + (long)pfVar8) + 8) !=
              lVar28 >> 0x20) {
            pfStack_2ec0 = (fdb_kvs_handle *)0x10eac3;
            compact_upto_test();
          }
          pcVar23 = pcVar23 + 1;
          lVar28 = lVar28 + -0x500000000;
          pfVar8 = (fdb_kvs_handle *)((long)pfVar8 + 0x18);
        } while (pcVar23 < pcStack_2e98);
      }
      __s = (code *)auStack_2e28;
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e8f3;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e909;
      fVar4 = fdb_compact_upto(pfStack_2ea0,(char *)__s,pfStack_2ea8[1].marker);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e92d;
        fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e88._32_8_,
                                  (fdb_kvs_handle **)(auStack_2e88 + 0x18),
                                  (pfStack_2ea8[1].kvs_markers)->seqnum);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e936;
          compact_upto_test();
          goto LAB_0010e936;
        }
LAB_0010e996:
        __s = (code *)auStack_2e28;
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e9a0;
        fdb_kvs_close((fdb_kvs_handle *)auStack_2e88._24_8_);
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e9af;
        fVar4 = fdb_free_snap_markers(pfStack_2ea8,(uint64_t)pcStack_2e98);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e9c1;
          fdb_close(pfStack_2ea0);
          lVar28 = 0;
          do {
            pfStack_2ec0 = (fdb_kvs_handle *)0x10e9d0;
            fdb_doc_free(*(fdb_doc **)(&fStack_2df8.kvs_config.create_if_missing + lVar28 * 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x14);
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e9de;
          fdb_shutdown();
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e9e3;
          memleak_end();
          pcVar23 = "single kv mode:";
          if ((char)iStack_2e8c != '\0') {
            pcVar23 = "multiple kv mode:";
          }
          pfStack_2ec0 = (fdb_kvs_handle *)0x10ea13;
          sprintf(acStack_2b58,"compact upto marker in file test %s",pcVar23);
          pcVar23 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2ec0 = (fdb_kvs_handle *)0x10ea40;
          iVar5 = fprintf(_stderr,pcVar23,acStack_2b58);
          return iVar5;
        }
        goto LAB_0010ead9;
      }
      goto LAB_0010eade;
    }
    if (pcStack_2e98 != (char *)0x8) {
      pfStack_2ec0 = (fdb_kvs_handle *)0x10e7d7;
      compact_upto_test();
    }
    auStack_2e88._8_8_ = ZEXT48(uVar27 + 1);
    pfVar8 = (fdb_kvs_handle *)auStack_2e88;
    pvVar17 = (void *)0x0;
    do {
      pcVar23 = (char *)((long)pvVar17 * 3);
      if ((fdb_custom_cmp_variable)pfStack_2ea8[(long)pvVar17].num_kvs_markers !=
          (fdb_custom_cmp_variable)auStack_2e88._8_8_) {
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e8b4;
        compact_upto_test();
      }
      __s = (code *)((long)pvVar17 * -5 + 0x14);
      lVar28 = 8;
      pfVar11 = (fdb_kvs_handle *)0x0;
      auStack_2e88._16_8_ = pvVar17;
      do {
        if (*(code **)(lVar28 + (long)&(pfStack_2ea8[(long)pvVar17].kvs_markers)->kv_store_name) !=
            __s) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10e88a;
          compact_upto_test();
        }
        pfStack_2ec0 = (fdb_kvs_handle *)0x10e83d;
        sprintf((char *)pfVar8,"kv%d",(ulong)pfVar11 & 0xffffffff);
        psVar3 = *(short **)((long)&pfStack_2ea8[(long)pvVar17].kvs_markers[-1].seqnum + lVar28);
        if ((char)psVar3[1] != auStack_2e88[2] || *psVar3 != auStack_2e88._0_2_) {
          pfStack_2ec0 = (fdb_kvs_handle *)0x10eacf;
          compact_upto_test();
          goto LAB_0010eacf;
        }
        pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
        lVar28 = lVar28 + 0x10;
      } while (pfVar14 != pfVar11);
      pvVar17 = (void *)(auStack_2e88._16_8_ + 1);
    } while ((fdb_kvs_handle *)pvVar17 != pfVar14);
LAB_0010e936:
    __s = (code *)auStack_2e28;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e954;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e96a;
    fVar4 = fdb_compact_upto(pfStack_2ea0,(char *)__s,pfStack_2ea8[1].marker);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
    pfStack_2ec0 = (fdb_kvs_handle *)0x10e98e;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e88._40_8_,
                              (fdb_kvs_handle **)(auStack_2e88 + 0x18),
                              pfStack_2ea8[1].kvs_markers[1].seqnum);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
  }
  else {
LAB_0010ead4:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10ead9;
    compact_upto_test();
LAB_0010ead9:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eade;
    compact_upto_test();
LAB_0010eade:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eae3;
    compact_upto_test();
LAB_0010eae3:
    pfStack_2ec0 = (fdb_kvs_handle *)0x10eae8;
    compact_upto_test();
  }
  pfStack_2ec0 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_2ee8 = __s;
  pfStack_2ee0 = pfVar8;
  pfStack_2ed8 = pfVar11;
  pcStack_2ed0 = pcVar23;
  lStack_2ec8 = lVar28;
  pfStack_2ec0 = pfVar14;
  gettimeofday((timeval *)(auStack_3360 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  pbVar6 = (btree *)auStack_3360;
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_32f0[0x110] = '\0';
  auStack_32f0[0x111] = '\0';
  auStack_32f0[0x112] = '\0';
  auStack_32f0[0x113] = '\x01';
  auStack_32f0[0x114] = '\0';
  auStack_32f0[0x115] = '\0';
  auStack_32f0[0x116] = '\0';
  auStack_32f0[0x117] = '\0';
  auStack_32f0[0x118] = '\0';
  auStack_32f0[0x119] = '\x04';
  auStack_32f0[0x11a] = '\0';
  auStack_32f0[0x11b] = '\0';
  auStack_32f0[0x11c] = '\0';
  auStack_32f0[0x11d] = '\0';
  auStack_32f0[0x11e] = '\0';
  auStack_32f0[0x11f] = '\0';
  auStack_32f0._300_4_ = 1;
  auStack_32f0[0x137] = 0;
  pbVar33 = (btree *)&pfStack_3398;
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)pbVar33,"./compact_test1",(fdb_config *)(auStack_32f0 + 0x108));
  ppfVar18 = &pfStack_33a0;
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_3398,ppfVar18,(fdb_kvs_config *)pbVar6);
  pfStack_33b8 = (fdb_kvs_handle *)0x10eb93;
  fVar4 = fdb_set_log_callback(pfStack_33a0,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_33b8 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_3388,"./compact_test1",(fdb_config *)(auStack_32f0 + 0x108)
            );
    ppfVar18 = &pfStack_3390;
    pfStack_33b8 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3388._0_8_,ppfVar18,(fdb_kvs_config *)auStack_3360);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ebe2;
    fVar4 = fdb_set_log_callback(pfStack_3390,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar28 = 0;
    uVar15 = 0;
    do {
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_2ff0,"key%d",uVar15 & 0xffffffff);
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_32f0 + 0x200,"meta%d",uVar15 & 0xffffffff);
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_32f0,"body%d",uVar15 & 0xffffffff);
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec4a;
      sVar7 = strlen(acStack_2ff0);
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec5d;
      sVar9 = strlen(auStack_32f0 + 0x200);
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec6d;
      sVar10 = strlen(auStack_32f0);
      pfStack_33b8 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_3388 + lVar28 + 8),acStack_2ff0,sVar7,auStack_32f0 + 0x200
                     ,sVar9,auStack_32f0,sVar10);
      pfStack_33b8 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_33a0,*(fdb_doc **)(auStack_3388 + uVar15 * 8 + 8));
      uVar15 = uVar15 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar15 == 1);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_33a8,*(void **)(auStack_3388._16_8_ + 0x20),
                   *(size_t *)auStack_3388._16_8_,*(void **)(auStack_3388._16_8_ + 0x38),
                   *(size_t *)(auStack_3388._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_33a8->file = true;
    pfStack_33b8 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_33a0,(fdb_doc *)pfStack_33a8);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_33a8);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_3398,'\x01');
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_3398,"./compact_test2");
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_2ff0,"key%d",2);
    pbVar33 = (btree *)(auStack_32f0 + 0x200);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)pbVar33,"meta%d",2);
    pfVar8 = (fdb_kvs_handle *)auStack_32f0;
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)pfVar8,"body%d",2);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed89;
    pfVar11 = (fdb_kvs_handle *)strlen(acStack_2ff0);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed94;
    pfVar14 = (fdb_kvs_handle *)strlen((char *)pbVar33);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ed9f;
    sVar7 = strlen((char *)pfVar8);
    pfStack_33b8 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_3388 + 0x18),acStack_2ff0,(size_t)pfVar11,pbVar33,
                   (size_t)pfVar14,pfVar8,sVar7);
    pfStack_33b8 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_33a0,(fdb_doc *)auStack_3388._24_8_);
    pfStack_33b8 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_3398,'\x01');
    pfStack_33b8 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_33a0);
    ppfVar18 = &pfStack_3390;
    pfStack_33b8 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_3390);
    pfStack_33b8 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_3398);
    pbVar6 = (btree *)auStack_3388;
    pfStack_33b8 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_3388._0_8_);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_33b8 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)pbVar6,"./compact_test1",(fdb_config *)(auStack_32f0 + 0x108));
    pfStack_33b8 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3388._0_8_,ppfVar18,(fdb_kvs_config *)auStack_3360);
    pfStack_33b8 = (fdb_kvs_handle *)0x10ee4d;
    fVar4 = fdb_set_log_callback(pfStack_3390,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar8 = (fdb_kvs_handle *)0x0;
      ppfVar18 = &pfStack_33a8;
      while( true ) {
        pfStack_33b8 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_3388 + (long)pfVar8 * 8 + 8))[4],
                       **(size_t **)(auStack_3388 + (long)pfVar8 * 8 + 8),(void *)0x0,0,(void *)0x0,
                       0);
        pfStack_33b8 = (fdb_kvs_handle *)0x10ee90;
        fVar4 = fdb_get(pfStack_3390,(fdb_doc *)pfStack_33a8);
        pfVar19 = pfStack_33a8;
        if (pfVar8 != (fdb_kvs_handle *)0x1) break;
        pfVar19 = pfVar11;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_33b8 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_33a8);
        pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
        pfVar11 = pfVar19;
        if (pfVar8 == (fdb_kvs_handle *)0x3) {
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_3388._0_8_,&fStack_3338);
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef28;
          iVar5 = strcmp("./compact_test2",fStack_3338.filename);
          if (iVar5 != 0) {
            pfStack_33b8 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_3390);
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_3388._0_8_);
          lVar28 = 0;
          do {
            pfStack_33b8 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_3388 + lVar28 * 8 + 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_33b8 = (fdb_kvs_handle *)0x10ef9a;
          iVar5 = fprintf(_stderr,pcVar23,"auto recovery after compaction test");
          return iVar5;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar6 = pfStack_33a8->staletree;
        pfVar14 = *(fdb_kvs_handle **)(auStack_3388 + (long)pfVar8 * 8 + 8);
        pbVar33 = pfVar14->staletree;
        pfStack_33b8 = (fdb_kvs_handle *)0x10eec9;
        iVar5 = bcmp(pbVar6,pbVar33,(size_t)(pfStack_33a8->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar6 = (pfVar19->field_6).seqtree;
          pbVar33 = (pfVar14->field_6).seqtree;
          pfStack_33b8 = (fdb_kvs_handle *)0x10eee8;
          iVar5 = bcmp(pbVar6,pbVar33,(size_t)(pfVar19->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010eef0;
          pfStack_33b8 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          pfVar11 = pfVar19;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar19 = pfVar11;
        pfStack_33b8 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_33b8 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      pfVar11 = pfVar19;
LAB_0010efc7:
      pfStack_33b8 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_33b8 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_33b8 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_33b8 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_3920 = (fdb_kvs_handle *)0x10effb;
  ppfStack_33e0 = ppfVar18;
  pfStack_33d8 = pfVar8;
  pfStack_33d0 = pfVar11;
  pbStack_33c8 = pbVar6;
  pbStack_33c0 = pbVar33;
  pfStack_33b8 = pfVar14;
  gettimeofday(&tStack_3890,(__timezone_ptr_t)0x0);
  pfStack_3920 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_3920 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3920 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_3880;
  pfStack_3920 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_34d8.buffercache_size = 0x1000000;
  fStack_34d8.wal_threshold = 0x400;
  fStack_34d8.flags = 1;
  fStack_34d8.compaction_threshold = '\0';
  ppfVar34 = &pfStack_38f8;
  pfStack_3920 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar34,"./compact_test1",&fStack_34d8);
  ppfVar18 = &pfStack_3900;
  pfStack_3920 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_38f8,ppfVar18,config);
  pfStack_3920 = (fdb_kvs_handle *)0x10f087;
  fVar4 = fdb_set_log_callback(pfStack_3900,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar8 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_3920 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_3768 + 0x100,"key%d",uVar15 & 0xffffffff);
      pfStack_3920 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_3768,"meta%d",uVar15 & 0xffffffff);
      pfStack_3920 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_3868,"body%d",uVar15 & 0xffffffff);
      ppfVar34 = (fdb_doc **)((long)apfStack_38e8 + (long)pfVar8);
      pfStack_3920 = (fdb_kvs_handle *)0x10f0ef;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_3768 + 0x100);
      pfVar14 = (fdb_kvs_handle *)auStack_3768;
      pfStack_3920 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar14);
      pfStack_3920 = (fdb_kvs_handle *)0x10f112;
      sVar7 = strlen(acStack_3868);
      pfStack_3920 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar34,auStack_3768 + 0x100,(size_t)pfVar11,pfVar14,(size_t)config,
                     acStack_3868,sVar7);
      pfStack_3920 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_3900,apfStack_38e8[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar8 = (fdb_kvs_handle *)((long)pfVar8 + 8);
    } while (uVar15 != 10);
    pfStack_3920 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_38f8,'\x01');
    pfStack_3920 = (fdb_kvs_handle *)0x10f17a;
    fVar4 = fdb_snapshot_open(pfStack_3900,&pfStack_38f0,10);
    ppfVar18 = (fdb_kvs_handle **)0xa;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_3920 = (fdb_kvs_handle *)0x10f193;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_38f8,"./compact_test2");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_3920 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_3908,apfStack_38e8[(long)config]->key,
                       apfStack_38e8[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3920 = (fdb_kvs_handle *)0x10f1d6;
        fVar4 = fdb_get(pfStack_3900,(fdb_doc *)pfStack_3908);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_3920 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_3920 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_3908);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_3920 = (fdb_kvs_handle *)0x10f205;
      iVar5 = stat("./compact_test1",(stat *)(auStack_3768 + 0x200));
      if (iVar5 == 0) {
        pfStack_3920 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_3920 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_3908,apfStack_38e8[(long)config]->key,
                       apfStack_38e8[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3920 = (fdb_kvs_handle *)0x10f249;
        fVar4 = fdb_get(pfStack_38f0,(fdb_doc *)pfStack_3908);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_3920 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_3908);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_3920 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_38f8);
          pfStack_3920 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar28 = 0;
          do {
            pfStack_3920 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_38e8[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 10);
          pfStack_3920 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_3920 = (fdb_kvs_handle *)0x10f2be;
          iVar5 = fprintf(_stderr,pcVar23,"unlink after compaction test");
          return iVar5;
        }
      }
LAB_0010f2d5:
      ppfVar18 = &pfStack_3908;
      pfStack_3920 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_3920 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_3920 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_3920 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_40b8 = (fdb_kvs_handle *)0x10f309;
  ppfStack_3948 = ppfVar18;
  pfStack_3940 = pfVar8;
  pfStack_3938 = pfVar11;
  pfStack_3930 = config;
  ppfStack_3928 = ppfVar34;
  pfStack_3920 = pfVar14;
  gettimeofday(&tStack_4030,(__timezone_ptr_t)0x0);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_40b8 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_40b8 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)auStack_4078;
  pfStack_40b8 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_3e28.buffercache_size = 0x1000000;
  fStack_3e28.wal_threshold = 0x400;
  fStack_3e28.flags = 1;
  fStack_3e28.compaction_threshold = '\0';
  _Var35._M_i = (__int_type_conflict)(auStack_4090 + 0x10);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var35._M_i,"./compact_test1",&fStack_3e28);
  ppfVar18 = (fdb_kvs_handle **)auStack_4090;
  pfStack_40b8 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_4090._16_8_,ppfVar18,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_40b8 = (fdb_kvs_handle *)0x10f394;
  pfVar19 = (fdb_kvs_handle *)auStack_4090._0_8_;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_4090._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar8 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_3d30 + 0x100,"key%d",uVar15 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_3d30,"meta%d",uVar15 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_4020,"body%d",uVar15 & 0xffffffff);
      _Var35._M_i = (long)apfStack_3f20 + (long)pfVar8;
      pfStack_40b8 = (fdb_kvs_handle *)0x10f3ff;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_3d30 + 0x100);
      pfVar14 = (fdb_kvs_handle *)auStack_3d30;
      pfStack_40b8 = (fdb_kvs_handle *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)pfVar14);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f422;
      sVar7 = strlen(acStack_4020);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var35._M_i,auStack_3d30 + 0x100,(size_t)pfVar11,pfVar14,
                     (size_t)info,acStack_4020,sVar7);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_4090._0_8_,apfStack_3f20[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar8 = (fdb_kvs_handle *)((long)pfVar8 + 8);
    } while (uVar15 != 0x1e);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_4090._16_8_,'\0');
    pfStack_40b8 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_4090 + 8),"./compact_test1.1",&fStack_3e28);
    ppfVar18 = (fdb_kvs_handle **)(auStack_40a0 + 8);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_4090._8_8_,ppfVar18,(char *)0x0,
                 (fdb_kvs_config *)auStack_4078);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f4bf;
    pfVar19 = (fdb_kvs_handle *)auStack_40a0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_40a0._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    pfVar8 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_3d30 + 0x100,"k2ey%d",uVar15 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_3d30,"m2eta%d",uVar15 & 0xffffffff);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_4020,"b2ody%d",uVar15 & 0xffffffff);
      _Var35._M_i = (__int_type_conflict)(auStack_3d30 + (long)pfVar8 + 0x200);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f52a;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_3d30 + 0x100);
      pfVar14 = (fdb_kvs_handle *)auStack_3d30;
      pfStack_40b8 = (fdb_kvs_handle *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)pfVar14);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f54d;
      sVar7 = strlen(acStack_4020);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var35._M_i,auStack_3d30 + 0x100,(size_t)pfVar11,pfVar14,
                     (size_t)info,acStack_4020,sVar7);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_40a0._8_8_,(fdb_doc *)auStack_3a40[uVar15 - 0x1e]);
      uVar15 = uVar15 + 1;
      pfVar8 = (fdb_kvs_handle *)((long)pfVar8 + 8);
    } while (uVar15 != 0x3c);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_4090._8_8_,'\0');
    pfStack_40b8 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_40a0._8_8_,(fdb_kvs_info *)(auStack_4078 + 0x18));
    ppfVar18 = apfStack_4058;
    if (apfStack_4058[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_40b8 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_40a0._8_8_);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_4090._8_8_);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f5e3;
    pfVar19 = (fdb_kvs_handle *)auStack_4090._16_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_4090._16_8_,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)auStack_4090;
    pfStack_40b8 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4090._0_8_);
    _Var35._M_i = (__int_type_conflict)(auStack_4090 + 0x10);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_4090._16_8_);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var35._M_i,"./compact_test1",&fStack_3e28);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_4090._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_4078);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f644;
    pfVar19 = (fdb_kvs_handle *)auStack_4090._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4090._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    pfVar8 = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)auStack_40a0;
    do {
      pfStack_40b8 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)apfStack_3f20 + (long)pfVar8))[4],
                     **(size_t **)((long)apfStack_3f20 + (long)pfVar8),(void *)0x0,0,(void *)0x0,0);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f68a;
      pfVar19 = (fdb_kvs_handle *)auStack_4090._0_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_4090._0_8_,(fdb_doc *)auStack_40a0._0_8_);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var35._M_i = (long)apfStack_3f20 + (long)pfVar8;
      pfStack_40b8 = (fdb_kvs_handle *)0x10f6b6;
      iVar5 = bcmp(*(btree **)(auStack_40a0._0_8_ + 0x38),(*(fdb_doc **)_Var35._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_40a0._0_8_)->custom_cmp);
      if (iVar5 != 0) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_40b8 = (fdb_kvs_handle *)0x10f6d3;
      iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_40a0._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var35._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_40a0._0_8_)->custom_cmp_param);
      if (iVar5 != 0) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_40b8 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_40a0._0_8_);
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).custom_cmp;
    } while (pfVar8 != (fdb_kvs_handle *)0xf0);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_4090 + 8),"./compact_test1.1",&fStack_3e28);
    info = (fdb_kvs_info *)(auStack_40a0 + 8);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_4090._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_4078);
    pfStack_40b8 = (fdb_kvs_handle *)0x10f757;
    pfVar19 = (fdb_kvs_handle *)auStack_40a0._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_40a0._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(auStack_4078 + 0x18);
      pfStack_40b8 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_40a0._8_8_,info);
      if (apfStack_4058[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var35._M_i = 0;
      ppfVar18 = (fdb_kvs_handle **)auStack_40a0;
      while( true ) {
        pfStack_40b8 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_3d30 + 0x200 + _Var35._M_i))[4],
                       **(size_t **)(auStack_3d30 + 0x200 + _Var35._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_40b8 = (fdb_kvs_handle *)0x10f7be;
        pfVar19 = (fdb_kvs_handle *)auStack_40a0._8_8_;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_40a0._8_8_,(fdb_doc *)auStack_40a0._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)(auStack_3d30 + 0x200 + _Var35._M_i);
        pfStack_40b8 = (fdb_kvs_handle *)0x10f7ea;
        iVar5 = bcmp(*(btree **)(auStack_40a0._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_40a0._0_8_)->custom_cmp);
        if (iVar5 != 0) {
          pfStack_40b8 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_40b8 = (fdb_kvs_handle *)0x10f807;
        iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_40a0._0_8_ + 0x40))
                     ->seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_40a0._0_8_)->custom_cmp_param);
        if (iVar5 != 0) {
          pfStack_40b8 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_40b8 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_40a0._0_8_);
        _Var35._M_i = _Var35._M_i + 8;
        if ((fdb_doc **)_Var35._M_i == (fdb_doc **)0x1e0) {
          lVar28 = 0;
          do {
            pfStack_40b8 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_3f20[lVar28]);
            pfStack_40b8 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_3a40[lVar28 + -0x1e]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x1e);
          lVar28 = 0;
          do {
            pfStack_40b8 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_3a40[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x1e);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4090._0_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_4090._16_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_40a0._8_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_4090._8_8_);
          pfStack_40b8 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_40b8 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_40b8 = (fdb_kvs_handle *)0x10f8e2;
          iVar5 = fprintf(_stderr,pcVar23,"compact overwrite");
          return iVar5;
        }
      }
LAB_0010f8f9:
      pfStack_40b8 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_40b8 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_40b8 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_4890 = (fdb_kvs_handle *)0x10f937;
  ppfStack_40e0 = ppfVar18;
  pfStack_40d8 = pfVar8;
  pfStack_40d0 = pfVar11;
  pfStack_40c8 = info;
  ppfStack_40c0 = (fdb_doc **)_Var35._M_i;
  pfStack_40b8 = pfVar14;
  gettimeofday(&tStack_4810,(__timezone_ptr_t)0x0);
  pfStack_4890 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_4890 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar22 = (fdb_kvs_handle *)auStack_4800;
  pfStack_4890 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_4800._8_8_ = (list *)0x0;
  auStack_4800._16_8_ = (list *)0x400;
  auStack_4800[0x2f] = '\0';
  if (pfVar19 == (fdb_kvs_handle *)0x0) {
    pfStack_4890 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4878;
    pfStack_4890 = (fdb_kvs_handle *)0x10f999;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_4800);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4890 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_4878;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4878,&pfStack_4870,&fStack_4858);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar28 = 0;
      uVar15 = 0;
      do {
        pfStack_4890 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_4508,"key%d",uVar15 & 0xffffffff);
        pfStack_4890 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_4800 + 0x1f8,"meta%d",uVar15 & 0xffffffff);
        pfStack_4890 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_4800 + 0xf8,"body%d",uVar15 & 0xffffffff);
        pfStack_4890 = (fdb_kvs_handle *)0x10fa20;
        pfVar11 = (fdb_kvs_handle *)strlen(acStack_4508);
        pfVar14 = (fdb_kvs_handle *)(auStack_4800 + 0x1f8);
        pfStack_4890 = (fdb_kvs_handle *)0x10fa33;
        sVar7 = strlen((char *)pfVar14);
        pfStack_4890 = (fdb_kvs_handle *)0x10fa43;
        sVar9 = strlen(auStack_4800 + 0xf8);
        pfStack_4890 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_4408 + lVar28),acStack_4508,(size_t)pfVar11,
                       pfVar14,sVar7,auStack_4800 + 0xf8,sVar9);
        pfStack_4890 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_4870,apfStack_4408[uVar15]);
        uVar15 = uVar15 + 1;
        lVar28 = lVar28 + 8;
      } while (uVar15 != 100);
      pfStack_4890 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_4878,'\0');
      pfStack_4890 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_4870,(fdb_kvs_info *)auStack_4840);
      pfVar19 = (fdb_kvs_handle *)(auStack_4840 + 0x10);
      if ((filemgr *)auStack_4840._16_8_ != (filemgr *)0x64) {
        pfStack_4890 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar28 = 0;
      _Var35._M_i = (__int_type_conflict)&pfStack_4868;
      do {
        pfStack_4890 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_4870,apfStack_4408[lVar28]);
        if (lVar28 == 0x32) {
          pfStack_4890 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var35._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_4878);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      pfStack_4890 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_4868,&pvStack_4860);
      pfStack_4890 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_4878,'\x01');
      pfStack_4890 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_4870,(fdb_kvs_info *)auStack_4840);
      if ((filemgr *)auStack_4840._16_8_ != (filemgr *)0x0) {
        pfStack_4890 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_4890 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_4870);
      pfVar22 = (fdb_kvs_handle *)&pfStack_4878;
      pfStack_4890 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_4878);
      pfStack_4890 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar22;
      fVar4 = fdb_open((fdb_file_handle **)pfVar22,"./compact_test1",(fdb_config *)auStack_4800);
      pfVar8 = (fdb_kvs_handle *)0x64;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_4890 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_4878;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4878,&pfStack_4870,&fStack_4858);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_4890 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_4870,(fdb_kvs_info *)auStack_4840);
        if ((filemgr *)auStack_4840._16_8_ != (filemgr *)0x0) {
          pfStack_4890 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar28 = 0;
        do {
          pfStack_4890 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_4408[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 100);
        pfStack_4890 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_4870);
        pfStack_4890 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_4878);
        pfStack_4890 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_4890 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pfStack_4890 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar23,"multi thread client shutdown");
        return 0;
      }
    }
    else {
      pfStack_4890 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_4890 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_4890 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_4890 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_4890 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4878;
    pfStack_4890 = (fdb_kvs_handle *)0x10fc41;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_4800);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_4890 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_4878;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_4878,(char *)0x0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4890 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_4878);
      pfStack_4890 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_4890 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar20 = (char *)0x0;
  pfStack_18648 = (fdb_kvs_handle *)0x10fcab;
  pfStack_18600 = ptr_fhandle;
  pfStack_48b8 = pfVar19;
  pfStack_48b0 = pfVar8;
  pfStack_48a8 = pfVar11;
  pfStack_48a0 = pfVar22;
  ppfStack_4898 = (fdb_doc **)_Var35._M_i;
  pfStack_4890 = pfVar14;
  gettimeofday(&tStack_18498,(__timezone_ptr_t)0x0);
  pfStack_18648 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_18648 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar19 = (fdb_kvs_handle *)auStack_185a0;
  pfStack_18648 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_18648 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_185a0._8_8_ = (kvs_ops_stat *)0x0;
  auStack_185a0._16_8_ = (fdb_file_handle *)0x400;
  auStack_185a0._36_4_ = 1;
  auStack_185a0._46_2_ = 0x1e01;
  auStack_185a0._56_8_ = (docio_handle *)0x1;
  auStack_185a0._120_8_ = 0;
  pcVar23 = auStack_18630;
  pfStack_18648 = (fdb_kvs_handle *)0x10fd11;
  fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)pfVar19);
  if (fVar4 == FDB_RESULT_INVALID_CONFIG) {
    auStack_185a0._120_8_ = 4;
    pfStack_18648 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_18630,"compact_test",(fdb_config *)auStack_185a0);
    pfVar19 = (fdb_kvs_handle *)(auStack_18630 + 8);
    pfStack_18648 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_18630._0_8_,(fdb_kvs_handle **)pfVar19,&fStack_185f8);
    pfStack_18648 = (fdb_kvs_handle *)0x10fd69;
    pcVar23 = (char *)auStack_18630._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18630._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_18648 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar20 = (char *)0x0;
    uVar15 = 0;
    do {
      pfStack_18648 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_18440,"key%04d",uVar15 & 0xffffffff);
      pfStack_18648 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_18340,"meta%04d",uVar15 & 0xffffffff);
      pfStack_18648 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_18240,"body%04d",uVar15 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(&afStack_18140[0].kvs_config.create_if_missing + (long)pcVar20);
      pfStack_18648 = (fdb_kvs_handle *)0x10fde9;
      sVar7 = strlen((char *)apfStack_18440);
      _Var35._M_i = sVar7 + 1;
      pfStack_18648 = (fdb_kvs_handle *)0x10fdf5;
      sVar7 = strlen(acStack_18340);
      pfVar11 = (fdb_kvs_handle *)(sVar7 + 1);
      pfStack_18648 = (fdb_kvs_handle *)0x10fe01;
      sVar7 = strlen(acStack_18240);
      pfStack_18648 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar14,apfStack_18440,_Var35._M_i,acStack_18340,(size_t)pfVar11,
                     acStack_18240,sVar7 + 1);
      pfStack_18648 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_18630._8_8_,
              *(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + uVar15 * 8));
      uVar15 = uVar15 + 1;
      pcVar20 = (char *)((long)pcVar20 + 8);
    } while (uVar15 != 10000);
    pfVar19 = (fdb_kvs_handle *)auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_18630._0_8_,'\0');
    pfStack_18648 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_18630._0_8_);
    pfStack_18648 = (fdb_kvs_handle *)0x10fe7d;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_185a0);
    pfVar8 = (fdb_kvs_handle *)0x2710;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_18648 = (fdb_kvs_handle *)0x10fe99;
    pcVar23 = (char *)auStack_18630._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18630._0_8_,(fdb_kvs_handle **)(auStack_18630 + 8)
                       ,&fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_18648 = (fdb_kvs_handle *)0x10feb9;
    pcVar23 = (char *)auStack_18630._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18630._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar19 = (fdb_kvs_handle *)&_Stack_18488;
    pfStack_18648 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_18630._0_8_,(fdb_file_info *)pfVar19);
    pfStack_18648 = (fdb_kvs_handle *)0x10fee5;
    iVar5 = strcmp((char *)_Stack_18488._M_i,"compact_test");
    if (iVar5 != 0) {
      pfStack_18648 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar20 = "key%04d";
    _Var35._M_i = (__int_type_conflict)apfStack_18440;
    pfVar11 = (fdb_kvs_handle *)0x0;
    pfVar22 = pfVar14;
    do {
      pfStack_18648 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var35._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_18648 = (fdb_kvs_handle *)0x10ff20;
      sVar7 = strlen((char *)_Var35._M_i);
      pfStack_18648 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_18618,(void *)_Var35._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_18648 = (fdb_kvs_handle *)0x10ff50;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_18630._8_8_,(fdb_doc *)pfStack_18618);
      pfVar14 = pfStack_18618;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_18648 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar19 = (fdb_kvs_handle *)(pfStack_18618->field_6).seqtree;
      pfVar8 = *(fdb_kvs_handle **)
                (*(long *)(&afStack_18140[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_18648 = (fdb_kvs_handle *)0x10ff7c;
      iVar5 = bcmp(pfVar19,pfVar8,(size_t)(pfStack_18618->kvs_config).custom_cmp_param);
      pfVar22 = pfVar14;
      if (iVar5 != 0) {
        pfStack_18648 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_18648 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_18648 = (fdb_kvs_handle *)0x10ffb0;
    pcVar23 = (char *)auStack_18630._8_8_;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_18630._8_8_,
                              (fdb_kvs_handle **)&pfStack_185d8,10000);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_18648 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_185d8);
    pfVar19 = (fdb_kvs_handle *)auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_18630._0_8_);
    pfStack_18648 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_18648 = (fdb_kvs_handle *)0x10fff2;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_18648 = (fdb_kvs_handle *)0x11000e;
    pcVar23 = (char *)auStack_18630._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18630._0_8_,(fdb_kvs_handle **)(auStack_18630 + 8)
                       ,&fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_18648 = (fdb_kvs_handle *)0x11002e;
    pcVar23 = (char *)auStack_18630._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18630._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar20 = "key%04d";
    _Var35._M_i = (__int_type_conflict)apfStack_18440;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_18648 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var35._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_18648 = (fdb_kvs_handle *)0x110060;
      sVar7 = strlen((char *)_Var35._M_i);
      pfStack_18648 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_18618,(void *)_Var35._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_18648 = (fdb_kvs_handle *)0x110090;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_18630._8_8_,(fdb_doc *)pfStack_18618);
      pfVar22 = pfStack_18618;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar19 = (fdb_kvs_handle *)(pfStack_18618->field_6).seqtree;
      pfVar8 = *(fdb_kvs_handle **)
                (*(long *)(&afStack_18140[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_18648 = (fdb_kvs_handle *)0x1100bc;
      iVar5 = bcmp(pfVar19,pfVar8,(size_t)(pfStack_18618->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001107eb;
      pfStack_18648 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfVar14 = pfVar22;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfVar19 = (fdb_kvs_handle *)auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_18630._0_8_);
    pfStack_18648 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_18648 = (fdb_kvs_handle *)0x11010c;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_18648 = (fdb_kvs_handle *)0x110128;
    pcVar23 = (char *)auStack_18630._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18630._0_8_,(fdb_kvs_handle **)(auStack_18630 + 8)
                       ,&fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_18648 = (fdb_kvs_handle *)0x110148;
    pcVar23 = (char *)auStack_18630._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18630._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar20 = "key%04d";
    _Var35._M_i = (__int_type_conflict)apfStack_18440;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_18648 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var35._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_18648 = (fdb_kvs_handle *)0x11017a;
      sVar7 = strlen((char *)_Var35._M_i);
      pfStack_18648 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_18618,(void *)_Var35._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_18648 = (fdb_kvs_handle *)0x1101aa;
      pcVar23 = (char *)auStack_18630._8_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_18630._8_8_,(fdb_doc *)pfStack_18618);
      pfVar22 = pfStack_18618;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar19 = (fdb_kvs_handle *)(pfStack_18618->field_6).seqtree;
      pfVar8 = *(fdb_kvs_handle **)
                (*(long *)(&afStack_18140[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_18648 = (fdb_kvs_handle *)0x1101d6;
      iVar5 = bcmp(pfVar19,pfVar8,(size_t)(pfStack_18618->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001107fb;
      pfStack_18648 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfVar14 = pfVar22;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_18648 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_18630._0_8_);
    pcVar23 = (char *)&pfStack_18608;
    pfStack_18648 = (fdb_kvs_handle *)0x110219;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_less",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_18648 = (fdb_kvs_handle *)0x110238;
    pcVar23 = (char *)pfStack_18608;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18608,(fdb_kvs_handle **)&pfStack_185c0,
                       &fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_185a0._46_2_ = auStack_185a0._46_2_ & 0xff;
    pcVar23 = (char *)&pfStack_18610;
    pfStack_18648 = (fdb_kvs_handle *)0x11025d;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_18648 = (fdb_kvs_handle *)0x110279;
    pcVar23 = (char *)pfStack_18610;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18610,(fdb_kvs_handle **)&aStack_185c8.seqtree,
                       &fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_185a0._46_2_ = auStack_185a0._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_18620;
    pfStack_18648 = (fdb_kvs_handle *)0x11029e;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_18648 = (fdb_kvs_handle *)0x1102ba;
    pcVar23 = (char *)pfStack_18620;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18620,(fdb_kvs_handle **)&aStack_185d0.seqtree,
                       &fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_185a0._46_2_ = 0x1e01;
    pcVar23 = auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x1102e1;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_18648 = (fdb_kvs_handle *)0x1102fd;
    pcVar23 = (char *)auStack_18630._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18630._0_8_,(fdb_kvs_handle **)(auStack_18630 + 8)
                       ,&fStack_185f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_18648 = (fdb_kvs_handle *)0x11031d;
    pcVar23 = (char *)auStack_18630._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_18630._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar20 = (char *)0x0;
    pfStack_18648 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_18648 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_185a0 + 0xf8),(__timezone_ptr_t)0x0);
    tVar37.tv_usec = _Stack_184a0._M_i;
    tVar37.tv_sec = auStack_185a0._248_8_;
    do {
      pfVar22 = (fdb_kvs_handle *)0xfffffffffffec780;
      pfVar11 = (fdb_kvs_handle *)0x0;
      iVar5 = 0;
      aStack_185e0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
      do {
        pfStack_18648 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_18630._8_8_,*(fdb_doc **)(acStack_48c0 + (long)pfVar22));
        pfStack_18648 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_18630._0_8_,'\0');
        uVar27 = (int)((ulong)pfVar11 / 100) * 100 + iVar5;
        pfVar8 = (fdb_kvs_handle *)(ulong)uVar27;
        if (uVar27 == 0) {
          pfStack_18648 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_185c0,*(fdb_doc **)(acStack_48c0 + (long)pfVar22));
          pfStack_18648 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_18608,'\0');
        }
        pfStack_18648 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_185c8.seqtree,*(fdb_doc **)(acStack_48c0 + (long)pfVar22));
        pfStack_18648 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_18610,'\0');
        pfStack_18648 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_185d0.seqtree,*(fdb_doc **)(acStack_48c0 + (long)pfVar22));
        pfStack_18648 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_18620,'\0');
        pfStack_18648 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_185b0,(__timezone_ptr_t)0x0);
        pfStack_18648 = (fdb_kvs_handle *)0x110420;
        tVar36 = _utime_gap(tVar37,tStack_185b0);
        if (pfStack_18600 <= (fdb_kvs_handle *)tVar36.tv_sec) {
          pcVar20 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar5 = iVar5 + -1;
        pfVar11 = (fdb_kvs_handle *)(ulong)((int)pfVar11 + 1);
        pfVar22 = (fdb_kvs_handle *)&(pfVar22->kvs_config).custom_cmp;
        pcVar20 = (char *)aStack_185e0;
      } while (pfVar22 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar20 == 0);
    pfStack_18648 = (fdb_kvs_handle *)0x110459;
    pcVar23 = (char *)auStack_18630._0_8_;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_18630._0_8_,0x3c);
    pfVar19 = (fdb_kvs_handle *)auStack_185a0._248_8_;
    _Var35._M_i = _Stack_184a0._M_i;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_18648 = (fdb_kvs_handle *)0x110470;
    pcVar23 = (char *)auStack_18630._0_8_;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_18630._0_8_,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_18648 = (fdb_kvs_handle *)0x110484;
    pcVar23 = (char *)pfStack_18610;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_18610,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_18648 = (fdb_kvs_handle *)0x11049d;
    pcVar23 = (char *)pfStack_18620;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_18620,"compact_test_manual_compacted");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_185a0._46_2_ = auStack_185a0._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_185b8;
    pfStack_18648 = (fdb_kvs_handle *)0x1104c5;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_18648 = (fdb_kvs_handle *)0x1104e1;
    pcVar23 = (char *)pfStack_18620;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_18620,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_18648 = (fdb_kvs_handle *)0x1104f7;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_185b8);
    pcVar23 = (char *)pfStack_185b8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_18648 = (fdb_kvs_handle *)0x110513;
    pcVar23 = (char *)pfStack_18620;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_18620,'\x01',10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_18648 = (fdb_kvs_handle *)0x11052f;
    pcVar23 = (char *)pfStack_18620;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_18620,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_18648 = (fdb_kvs_handle *)0x110541;
    pcVar23 = (char *)pfStack_18620;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18620);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_185a0[0x2e] = 1;
    pcVar23 = (char *)&pfStack_18620;
    pfStack_18648 = (fdb_kvs_handle *)0x110566;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_18648 = (fdb_kvs_handle *)0x11057c;
    pcVar23 = (char *)pfStack_18610;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_18610,'\0',0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_18648 = (fdb_kvs_handle *)0x11058e;
    pcVar23 = (char *)pfStack_18610;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18610);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_185a0._46_2_ = auStack_185a0._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_18610;
    pfStack_18648 = (fdb_kvs_handle *)0x1105b3;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar20 = "compact_test_non.manual";
    pfStack_18648 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_18610,"compact_test_non.manual");
    pfVar19 = (fdb_kvs_handle *)auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_18630._0_8_);
    pfStack_18648 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_18608);
    pfStack_18648 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_18620);
    auStack_185a0[0x2e] = 1;
    pfStack_18648 = (fdb_kvs_handle *)0x110607;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test_non.manual",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar23 = "compact_test_non.manual";
    pfStack_18648 = (fdb_kvs_handle *)0x110624;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_185a0._46_2_ = auStack_185a0._46_2_ & 0xff00;
    pcVar23 = auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x11064a;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar23 = "compact_test_manual_compacted";
    pfStack_18648 = (fdb_kvs_handle *)0x110667;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_185a0[0x2e] = 1;
    pcVar23 = "compact_test_manual_compacted";
    pfStack_18648 = (fdb_kvs_handle *)0x110688;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_185a0._46_2_ = auStack_185a0._46_2_ & 0xff00;
    pcVar23 = "compact_test_non.manual";
    pfStack_18648 = (fdb_kvs_handle *)0x1106a8;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_18648 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_18610);
    pfStack_18648 = (fdb_kvs_handle *)0x1106c0;
    fVar4 = fdb_shutdown();
    pcVar23 = (char *)pfStack_18610;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar23 = "compact_test_non.manual";
    pfStack_18648 = (fdb_kvs_handle *)0x1106dc;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_185a0._36_4_ = 2;
    pcVar23 = auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x110704;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar23 = auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x110726;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar23 = auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x110748;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_185a0);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar23 = auStack_18630;
    pfStack_18648 = (fdb_kvs_handle *)0x11076a;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non.manual",
                     (fdb_config *)auStack_185a0);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      lVar28 = 0;
      do {
        pfStack_18648 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_18140[0].kvs_config.create_if_missing + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10000);
      pfStack_18648 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_18648 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_18648 = (fdb_kvs_handle *)0x1107c9;
      iVar5 = fprintf(_stderr,pcVar23,"compaction daemon test");
      return iVar5;
    }
  }
  else {
LAB_0011080b:
    pfStack_18648 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_18648 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_18648 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_18648 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_18648 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_18648 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_18648 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_18648 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar22 = pfVar14;
LAB_00110833:
    pfStack_18648 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_18648 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_18648 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_18648 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_18648 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_18648 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_18648 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_18648 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_18648 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_18648 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_18648 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_18648 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_18648 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_18648 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_18648 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_18648 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_18648 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_18648 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_18648 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_18648 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_18648 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_18648 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_18648 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_18648 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_18648 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_18648 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_18648 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_18648 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_18648 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_18648 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_18648 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_18648 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_18648 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_18648 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_18648 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_18648 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_18648 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_18648 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_18648 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_187e0 = (fdb_kvs_handle *)0x110916;
  aStack_18670 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  pfStack_18668 = pfVar8;
  pfStack_18660 = pfVar11;
  pfStack_18658 = pfVar19;
  ppfStack_18650 = (fdb_doc **)_Var35._M_i;
  pfStack_18648 = pfVar22;
  gettimeofday(&tStack_18790,(__timezone_ptr_t)0x0);
  pfStack_187e0 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_187e0 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_187e0 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_1873a = 1;
  uStack_18730._0_2_ = 1;
  uStack_18730._2_2_ = 0;
  uStack_18730._4_4_ = 0;
  pfStack_187e0 = (fdb_kvs_handle *)0x110955;
  fVar4 = fdb_open(&pfStack_187d0,"compact_test",(fdb_config *)(auStack_18780 + 0x18));
  pfVar30 = (fdb_config *)(auStack_18780 + 0x18);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar30 = (fdb_config *)auStack_18780;
    pfStack_187e0 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_187e0 = (fdb_kvs_handle *)0x11097c;
    fVar4 = fdb_kvs_open_default(pfStack_187d0,&pfStack_187c8,(fdb_kvs_config *)pfVar30);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_187e0 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_187a0,(__timezone_ptr_t)0x0);
    pfStack_187e0 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar23 & 0xffffffff);
    tVar36.tv_usec = tStack_187a0.tv_usec;
    tVar36.tv_sec = tStack_187a0.tv_sec;
    pfVar11 = (fdb_kvs_handle *)((long)&atStack_187c0[1].tv_sec + 1);
    pfVar22 = (fdb_kvs_handle *)0x0;
    do {
      iVar5 = (int)pfVar22;
      pfStack_187e0 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)pfVar11,"%d",pfVar22);
      pfVar8 = pfStack_187c8;
      pfStack_187e0 = (fdb_kvs_handle *)0x1109d1;
      sVar7 = strlen((char *)pfVar11);
      pfStack_187e0 = (fdb_kvs_handle *)0x1109ec;
      fVar4 = fdb_set_kv(pfVar8,pfVar11,sVar7,"value",5);
      pfVar30 = (fdb_config *)tStack_187a0.tv_sec;
      _Var35._M_i = tStack_187a0.tv_usec;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_187e0 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_187e0 = (fdb_kvs_handle *)0x110a00;
      fVar4 = fdb_commit(pfStack_187d0,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_187e0 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_187e0 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_187c0,(__timezone_ptr_t)0x0);
      pfStack_187e0 = (fdb_kvs_handle *)0x110a29;
      tVar37 = _utime_gap(tVar36,atStack_187c0[0]);
    } while (((fdb_kvs_handle *)tVar37.tv_sec < pcVar23) &&
            (pfVar22 = (fdb_kvs_handle *)(ulong)(iVar5 + 1), iVar5 != 99999));
    pfStack_187e0 = (fdb_kvs_handle *)0x110a49;
    fVar4 = fdb_close(pfStack_187d0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_187e0 = (fdb_kvs_handle *)0x110a52;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_187e0 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_187e0 = (fdb_kvs_handle *)0x110a8c;
      iVar5 = fprintf(_stderr,pcVar23,"auto compaction with concurrent insert test");
      return iVar5;
    }
  }
  else {
LAB_00110aa8:
    pfStack_187e0 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_187e0 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_187e0 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_187e0 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_18808 = (fdb_kvs_handle *)pcVar23;
  pfStack_18800 = pfVar8;
  pfStack_187f8 = pfVar11;
  pfStack_187f0 = pfVar30;
  ppfStack_187e8 = (fdb_doc **)_Var35._M_i;
  pfStack_187e0 = pfVar22;
  gettimeofday(&tStack_18b10,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18b80._32_8_ = (btree *)0x0;
  auStack_18b80._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_18900.wal_threshold = 0x1000;
  fStack_18900.compaction_mode = '\x01';
  fStack_18900.compaction_threshold = '\n';
  fStack_18900.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar14 = (fdb_kvs_handle *)&pfStack_18ba0;
  kvs_config = (fdb_file_info *)0x1;
  fVar4 = fdb_open_custom_cmp((fdb_file_handle **)pfVar14,"compact_test",&fStack_18900,1,
                              (char **)(auStack_18b80 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18b80 + 0x18),(void **)0x0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18b80._16_8_ = afStack_18b00[0].doc_count;
    auStack_18b80._0_8_ = afStack_18b00[0].filename;
    auStack_18b80._8_8_ = afStack_18b00[0].new_filename;
    info_00 = (fdb_file_info *)auStack_18b98;
    pfVar14 = pfStack_18ba0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18ba0,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_18b80);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_18b88;
    kvs_config = (fdb_file_info *)auStack_18b80;
    pfVar14 = pfStack_18ba0;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18ba0,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar15 = 0;
    do {
      sprintf((char *)afStack_18b00,"key%06d",uVar15);
      sprintf((char *)afStack_18a00,"body%06d",uVar15);
      pfVar14 = (fdb_kvs_handle *)auStack_18b98._0_8_;
      sVar7 = strlen((char *)afStack_18b00);
      sVar9 = strlen((char *)afStack_18a00);
      kvs_config = afStack_18a00;
      info_00 = afStack_18b00;
      fVar4 = fdb_set_kv(pfVar14,afStack_18b00,sVar7,afStack_18a00,sVar9);
      handle = auStack_18b88;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar7 = strlen((char *)afStack_18b00);
      sVar9 = strlen((char *)afStack_18a00);
      kvs_config = afStack_18a00;
      info_00 = afStack_18b00;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_18b00,sVar7,afStack_18a00,sVar9);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar14 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar27 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar27;
    } while (uVar27 != 10000);
    kvs_config = (fdb_file_info *)auStack_18b80;
    auStack_18b80._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_18b98 + 8);
    pfVar14 = pfStack_18ba0;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18ba0,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_18b00;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config = afStack_18a00;
    sprintf((char *)kvs_config,"body%06d",0);
    sVar7 = strlen((char *)info_00);
    sVar9 = strlen((char *)kvs_config);
    fVar4 = fdb_set_kv((fdb_kvs_handle *)auStack_18b98._8_8_,info_00,sVar7,kvs_config,sVar9);
    pfVar14 = (fdb_kvs_handle *)auStack_18b98._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar14 = pfStack_18ba0;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18ba0,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar15 = 0;
    uVar31 = 0;
    do {
      sprintf((char *)afStack_18b00,"key%06d",uVar31);
      sprintf((char *)afStack_18a00,"body%06d",uVar31);
      pfVar14 = (fdb_kvs_handle *)auStack_18b98._0_8_;
      sVar7 = strlen((char *)afStack_18b00);
      sVar9 = strlen((char *)afStack_18a00);
      kvs_config = afStack_18a00;
      info_00 = afStack_18b00;
      fVar4 = fdb_set_kv(pfVar14,afStack_18b00,sVar7,afStack_18a00,sVar9);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_18b80 + 0x28);
      pfVar14 = pfStack_18ba0;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18ba0,info_00);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar15 < uStack_18b30) {
        uVar15 = uStack_18b30;
      }
      uVar27 = (int)uVar31 + 1;
      uVar31 = (ulong)uVar27;
    } while (uVar27 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar14 = pfStack_18ba0;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18ba0,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_18b80 + 0x28);
    pfVar14 = pfStack_18ba0;
    fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18ba0,info_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar15 < uStack_18b30) {
      uVar15 = uStack_18b30;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar15);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_18b80 + 0x28);
      pfVar14 = pfStack_18ba0;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18ba0,
                                (fdb_file_info *)(auStack_18b80 + 0x28));
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar15 <= uStack_18b30);
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18ba0);
    pfVar14 = pfStack_18ba0;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      pfVar14 = pfStack_18ba0;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        iVar5 = fprintf(_stderr,pcVar23,"auto compaction with custom comparison function");
        return iVar5;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 != kvs_config) {
    __n = kvs_config;
    if (info_00 < kvs_config) {
      __n = info_00;
    }
    iVar5 = memcmp(pfVar14,__s2,(size_t)__n);
    if (iVar5 == 0) {
      iVar5 = (int)info_00 - (int)kvs_config;
    }
    return iVar5;
  }
  iVar5 = memcmp(pfVar14,__s2,(size_t)info_00);
  return iVar5;
}

Assistant:

static fdb_compact_decision compaction_cb(fdb_file_handle *fhandle,
                            fdb_compaction_status status, const char *kv_name,
                            fdb_doc *doc, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    fdb_doc *rdoc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_args *args = (struct cb_args *)ctx;

    (void) doc;
    (void) new_offset;

    if (status == FDB_CS_BEGIN) {
        args->begin = true;
    } else if (status == FDB_CS_END) {
        args->end = true;
    } else if (status == FDB_CS_FLUSH_WAL) {
        args->wal_flush = true;
    } else if (status == FDB_CS_MOVE_DOC) {
        if (doc->deleted) {
            ret = FDB_CS_DROP_DOC;
        }

        args->n_moved_docs++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);

        if (fhandle->root->config.multi_kv_instances) {
            TEST_CMP(kv_name, "db", 2);
        } else {
            TEST_CMP(kv_name, "default", 7);
        }
    } else { // FDB_CS_BATCH_MOVE
        args->n_batch_move++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK (s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    return ret;
}